

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<8,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Primitive PVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [12];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  byte bVar74;
  byte bVar75;
  ulong uVar76;
  byte bVar77;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  byte bVar78;
  byte bVar79;
  long lVar80;
  long lVar81;
  bool bVar82;
  ulong uVar83;
  uint uVar84;
  undefined1 auVar93 [16];
  uint uVar141;
  uint uVar142;
  uint uVar144;
  uint uVar145;
  uint uVar146;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  uint uVar143;
  uint uVar147;
  undefined1 auVar133 [32];
  undefined1 auVar92 [16];
  undefined1 auVar134 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float pp;
  float fVar148;
  undefined4 uVar149;
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar194;
  float fVar195;
  float fVar212;
  float fVar213;
  undefined1 auVar196 [16];
  float fVar214;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [64];
  float fVar215;
  undefined1 auVar216 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  float fVar237;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar238;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar239 [16];
  float fVar241;
  undefined1 auVar240 [64];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [64];
  float fVar246;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  undefined1 auVar247 [64];
  float fVar254;
  undefined1 auVar255 [64];
  float fVar257;
  undefined1 auVar256 [32];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar262 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [64];
  vfloat<8> A;
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  bool local_9b9;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  uint local_8d4;
  uint local_8d0;
  undefined4 local_8cc;
  float local_8c8;
  float local_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [16];
  ulong local_888;
  ulong local_880;
  ulong local_878;
  RTCFilterFunctionNArguments local_870;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  Primitive *local_6f0;
  ulong local_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_690 [16];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  RTCHitN local_660 [16];
  undefined1 auStack_650 [16];
  undefined4 local_640;
  undefined4 uStack_63c;
  undefined4 uStack_638;
  undefined4 uStack_634;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [16];
  undefined8 local_610;
  undefined8 uStack_608;
  undefined1 local_600 [16];
  uint local_5f0;
  uint uStack_5ec;
  uint uStack_5e8;
  uint uStack_5e4;
  uint uStack_5e0;
  uint uStack_5dc;
  uint uStack_5d8;
  uint uStack_5d4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar135 [32];
  undefined1 auVar138 [32];
  undefined1 auVar261 [64];
  undefined1 auVar263 [64];
  
  PVar4 = prim[1];
  uVar76 = (ulong)(byte)PVar4;
  lVar81 = uVar76 * 0x25;
  fVar246 = *(float *)(prim + lVar81 + 0x12);
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar87 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar91 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar92 = vsubps_avx(auVar85,*(undefined1 (*) [16])(prim + lVar81 + 6));
  fVar215 = fVar246 * auVar92._0_4_;
  fVar148 = fVar246 * auVar91._0_4_;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar76 * 4 + 6);
  auVar97 = vpmovsxbd_avx2(auVar85);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar76 * 5 + 6);
  auVar98 = vpmovsxbd_avx2(auVar87);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar76 * 6 + 6);
  auVar99 = vpmovsxbd_avx2(auVar88);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar76 * 0xf + 6);
  auVar100 = vpmovsxbd_avx2(auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar106 = vpmovsxbd_avx2(auVar3);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar101 = vcvtdq2ps_avx(auVar106);
  auVar227._8_8_ = 0;
  auVar227._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar76 + 6);
  auVar102 = vpmovsxbd_avx2(auVar227);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar76 * 0x1a + 6);
  auVar103 = vpmovsxbd_avx2(auVar89);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar76 * 0x1b + 6);
  auVar104 = vpmovsxbd_avx2(auVar86);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar76 * 0x1c + 6);
  auVar96 = vpmovsxbd_avx2(auVar90);
  auVar105 = vcvtdq2ps_avx(auVar96);
  auVar114._4_4_ = fVar148;
  auVar114._0_4_ = fVar148;
  auVar114._8_4_ = fVar148;
  auVar114._12_4_ = fVar148;
  auVar114._16_4_ = fVar148;
  auVar114._20_4_ = fVar148;
  auVar114._24_4_ = fVar148;
  auVar114._28_4_ = fVar148;
  auVar119._8_4_ = 1;
  auVar119._0_8_ = 0x100000001;
  auVar119._12_4_ = 1;
  auVar119._16_4_ = 1;
  auVar119._20_4_ = 1;
  auVar119._24_4_ = 1;
  auVar119._28_4_ = 1;
  auVar94 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar108 = ZEXT1632(CONCAT412(fVar246 * auVar91._12_4_,
                                CONCAT48(fVar246 * auVar91._8_4_,
                                         CONCAT44(fVar246 * auVar91._4_4_,fVar148))));
  auVar107 = vpermps_avx2(auVar119,auVar108);
  auVar95 = vpermps_avx512vl(auVar94,auVar108);
  fVar248 = auVar95._0_4_;
  fVar249 = auVar95._4_4_;
  auVar108._4_4_ = fVar249 * auVar99._4_4_;
  auVar108._0_4_ = fVar248 * auVar99._0_4_;
  fVar250 = auVar95._8_4_;
  auVar108._8_4_ = fVar250 * auVar99._8_4_;
  fVar251 = auVar95._12_4_;
  auVar108._12_4_ = fVar251 * auVar99._12_4_;
  fVar252 = auVar95._16_4_;
  auVar108._16_4_ = fVar252 * auVar99._16_4_;
  fVar253 = auVar95._20_4_;
  auVar108._20_4_ = fVar253 * auVar99._20_4_;
  fVar173 = auVar95._24_4_;
  auVar108._24_4_ = fVar173 * auVar99._24_4_;
  auVar108._28_4_ = auVar106._28_4_;
  auVar106._4_4_ = auVar102._4_4_ * fVar249;
  auVar106._0_4_ = auVar102._0_4_ * fVar248;
  auVar106._8_4_ = auVar102._8_4_ * fVar250;
  auVar106._12_4_ = auVar102._12_4_ * fVar251;
  auVar106._16_4_ = auVar102._16_4_ * fVar252;
  auVar106._20_4_ = auVar102._20_4_ * fVar253;
  auVar106._24_4_ = auVar102._24_4_ * fVar173;
  auVar106._28_4_ = auVar96._28_4_;
  auVar96._4_4_ = auVar105._4_4_ * fVar249;
  auVar96._0_4_ = auVar105._0_4_ * fVar248;
  auVar96._8_4_ = auVar105._8_4_ * fVar250;
  auVar96._12_4_ = auVar105._12_4_ * fVar251;
  auVar96._16_4_ = auVar105._16_4_ * fVar252;
  auVar96._20_4_ = auVar105._20_4_ * fVar253;
  auVar96._24_4_ = auVar105._24_4_ * fVar173;
  auVar96._28_4_ = auVar95._28_4_;
  auVar85 = vfmadd231ps_fma(auVar108,auVar107,auVar98);
  auVar87 = vfmadd231ps_fma(auVar106,auVar107,auVar101);
  auVar88 = vfmadd231ps_fma(auVar96,auVar104,auVar107);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar114,auVar97);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar114,auVar100);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar103,auVar114);
  auVar118._4_4_ = fVar215;
  auVar118._0_4_ = fVar215;
  auVar118._8_4_ = fVar215;
  auVar118._12_4_ = fVar215;
  auVar118._16_4_ = fVar215;
  auVar118._20_4_ = fVar215;
  auVar118._24_4_ = fVar215;
  auVar118._28_4_ = fVar215;
  auVar96 = ZEXT1632(CONCAT412(fVar246 * auVar92._12_4_,
                               CONCAT48(fVar246 * auVar92._8_4_,
                                        CONCAT44(fVar246 * auVar92._4_4_,fVar215))));
  auVar106 = vpermps_avx2(auVar119,auVar96);
  auVar96 = vpermps_avx512vl(auVar94,auVar96);
  fVar246 = auVar96._0_4_;
  fVar248 = auVar96._4_4_;
  auVar107._4_4_ = fVar248 * auVar99._4_4_;
  auVar107._0_4_ = fVar246 * auVar99._0_4_;
  fVar249 = auVar96._8_4_;
  auVar107._8_4_ = fVar249 * auVar99._8_4_;
  fVar250 = auVar96._12_4_;
  auVar107._12_4_ = fVar250 * auVar99._12_4_;
  fVar251 = auVar96._16_4_;
  auVar107._16_4_ = fVar251 * auVar99._16_4_;
  fVar252 = auVar96._20_4_;
  auVar107._20_4_ = fVar252 * auVar99._20_4_;
  fVar253 = auVar96._24_4_;
  auVar107._24_4_ = fVar253 * auVar99._24_4_;
  auVar107._28_4_ = fVar148;
  auVar94._4_4_ = auVar102._4_4_ * fVar248;
  auVar94._0_4_ = auVar102._0_4_ * fVar246;
  auVar94._8_4_ = auVar102._8_4_ * fVar249;
  auVar94._12_4_ = auVar102._12_4_ * fVar250;
  auVar94._16_4_ = auVar102._16_4_ * fVar251;
  auVar94._20_4_ = auVar102._20_4_ * fVar252;
  auVar94._24_4_ = auVar102._24_4_ * fVar253;
  auVar94._28_4_ = auVar99._28_4_;
  auVar102._4_4_ = auVar105._4_4_ * fVar248;
  auVar102._0_4_ = auVar105._0_4_ * fVar246;
  auVar102._8_4_ = auVar105._8_4_ * fVar249;
  auVar102._12_4_ = auVar105._12_4_ * fVar250;
  auVar102._16_4_ = auVar105._16_4_ * fVar251;
  auVar102._20_4_ = auVar105._20_4_ * fVar252;
  auVar102._24_4_ = auVar105._24_4_ * fVar253;
  auVar102._28_4_ = auVar96._28_4_;
  auVar2 = vfmadd231ps_fma(auVar107,auVar106,auVar98);
  auVar3 = vfmadd231ps_fma(auVar94,auVar106,auVar101);
  auVar227 = vfmadd231ps_fma(auVar102,auVar106,auVar104);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar2),auVar118,auVar97);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar118,auVar100);
  auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar265 = ZEXT3264(auVar97);
  auVar175 = vfmadd231ps_fma(ZEXT1632(auVar227),auVar118,auVar103);
  vandps_avx512vl(ZEXT1632(auVar85),auVar97);
  auVar116._8_4_ = 0x219392ef;
  auVar116._0_8_ = 0x219392ef219392ef;
  auVar116._12_4_ = 0x219392ef;
  auVar116._16_4_ = 0x219392ef;
  auVar116._20_4_ = 0x219392ef;
  auVar116._24_4_ = 0x219392ef;
  auVar116._28_4_ = 0x219392ef;
  uVar83 = vcmpps_avx512vl(auVar97,auVar116,1);
  bVar82 = (bool)((byte)uVar83 & 1);
  auVar95._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar85._0_4_;
  bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar85._4_4_;
  bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar85._8_4_;
  bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar85._12_4_;
  auVar95._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * 0x219392ef;
  auVar95._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * 0x219392ef;
  auVar95._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * 0x219392ef;
  auVar95._28_4_ = (uint)(byte)(uVar83 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar87),auVar97);
  uVar83 = vcmpps_avx512vl(auVar95,auVar116,1);
  bVar82 = (bool)((byte)uVar83 & 1);
  auVar109._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar87._0_4_;
  bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
  auVar109._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar87._4_4_;
  bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
  auVar109._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar87._8_4_;
  bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
  auVar109._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar87._12_4_;
  auVar109._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * 0x219392ef;
  auVar109._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * 0x219392ef;
  auVar109._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * 0x219392ef;
  auVar109._28_4_ = (uint)(byte)(uVar83 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar88),auVar97);
  uVar83 = vcmpps_avx512vl(auVar109,auVar116,1);
  bVar82 = (bool)((byte)uVar83 & 1);
  auVar97._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar88._0_4_;
  bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar88._4_4_;
  bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar88._8_4_;
  bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar88._12_4_;
  auVar97._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * 0x219392ef;
  auVar97._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * 0x219392ef;
  auVar97._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * 0x219392ef;
  auVar97._28_4_ = (uint)(byte)(uVar83 >> 7) * 0x219392ef;
  auVar98 = vrcp14ps_avx512vl(auVar95);
  auVar117._8_4_ = 0x3f800000;
  auVar117._0_8_ = &DAT_3f8000003f800000;
  auVar117._12_4_ = 0x3f800000;
  auVar117._16_4_ = 0x3f800000;
  auVar117._20_4_ = 0x3f800000;
  auVar117._24_4_ = 0x3f800000;
  auVar117._28_4_ = 0x3f800000;
  auVar85 = vfnmadd213ps_fma(auVar95,auVar98,auVar117);
  auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar109);
  auVar87 = vfnmadd213ps_fma(auVar109,auVar98,auVar117);
  auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar97);
  auVar88 = vfnmadd213ps_fma(auVar97,auVar98,auVar117);
  auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar98,auVar98);
  fVar246 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar81 + 0x16)) *
            *(float *)(prim + lVar81 + 0x1a);
  auVar115._4_4_ = fVar246;
  auVar115._0_4_ = fVar246;
  auVar115._8_4_ = fVar246;
  auVar115._12_4_ = fVar246;
  auVar115._16_4_ = fVar246;
  auVar115._20_4_ = fVar246;
  auVar115._24_4_ = fVar246;
  auVar115._28_4_ = fVar246;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 7 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0xb + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar97);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 9 + 6));
  auVar2 = vfmadd213ps_fma(auVar98,auVar115,auVar97);
  auVar97 = vcvtdq2ps_avx(auVar99);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0xd + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar97);
  auVar3 = vfmadd213ps_fma(auVar98,auVar115,auVar97);
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x12 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  uVar83 = (ulong)(uint)((int)(uVar76 * 5) << 2);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 2 + uVar83 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar97);
  auVar227 = vfmadd213ps_fma(auVar98,auVar115,auVar97);
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x18 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar97);
  auVar89 = vfmadd213ps_fma(auVar98,auVar115,auVar97);
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x1d + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 + (ulong)(byte)PVar4 * 0x20 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar97);
  auVar86 = vfmadd213ps_fma(auVar98,auVar115,auVar97);
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar4 * 0x20 - uVar76) + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x23 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar97);
  auVar90 = vfmadd213ps_fma(auVar98,auVar115,auVar97);
  auVar97 = vsubps_avx(ZEXT1632(auVar2),ZEXT1632(auVar91));
  auVar103._4_4_ = auVar85._4_4_ * auVar97._4_4_;
  auVar103._0_4_ = auVar85._0_4_ * auVar97._0_4_;
  auVar103._8_4_ = auVar85._8_4_ * auVar97._8_4_;
  auVar103._12_4_ = auVar85._12_4_ * auVar97._12_4_;
  auVar103._16_4_ = auVar97._16_4_ * 0.0;
  auVar103._20_4_ = auVar97._20_4_ * 0.0;
  auVar103._24_4_ = auVar97._24_4_ * 0.0;
  auVar103._28_4_ = auVar97._28_4_;
  auVar97 = vsubps_avx(ZEXT1632(auVar3),ZEXT1632(auVar91));
  auVar113._0_4_ = auVar85._0_4_ * auVar97._0_4_;
  auVar113._4_4_ = auVar85._4_4_ * auVar97._4_4_;
  auVar113._8_4_ = auVar85._8_4_ * auVar97._8_4_;
  auVar113._12_4_ = auVar85._12_4_ * auVar97._12_4_;
  auVar113._16_4_ = auVar97._16_4_ * 0.0;
  auVar113._20_4_ = auVar97._20_4_ * 0.0;
  auVar113._24_4_ = auVar97._24_4_ * 0.0;
  auVar113._28_4_ = 0;
  auVar97 = vsubps_avx(ZEXT1632(auVar227),ZEXT1632(auVar92));
  auVar104._4_4_ = auVar87._4_4_ * auVar97._4_4_;
  auVar104._0_4_ = auVar87._0_4_ * auVar97._0_4_;
  auVar104._8_4_ = auVar87._8_4_ * auVar97._8_4_;
  auVar104._12_4_ = auVar87._12_4_ * auVar97._12_4_;
  auVar104._16_4_ = auVar97._16_4_ * 0.0;
  auVar104._20_4_ = auVar97._20_4_ * 0.0;
  auVar104._24_4_ = auVar97._24_4_ * 0.0;
  auVar104._28_4_ = auVar97._28_4_;
  auVar97 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar92));
  auVar111._0_4_ = auVar87._0_4_ * auVar97._0_4_;
  auVar111._4_4_ = auVar87._4_4_ * auVar97._4_4_;
  auVar111._8_4_ = auVar87._8_4_ * auVar97._8_4_;
  auVar111._12_4_ = auVar87._12_4_ * auVar97._12_4_;
  auVar111._16_4_ = auVar97._16_4_ * 0.0;
  auVar111._20_4_ = auVar97._20_4_ * 0.0;
  auVar111._24_4_ = auVar97._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar97 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar175));
  auVar105._4_4_ = auVar88._4_4_ * auVar97._4_4_;
  auVar105._0_4_ = auVar88._0_4_ * auVar97._0_4_;
  auVar105._8_4_ = auVar88._8_4_ * auVar97._8_4_;
  auVar105._12_4_ = auVar88._12_4_ * auVar97._12_4_;
  auVar105._16_4_ = auVar97._16_4_ * 0.0;
  auVar105._20_4_ = auVar97._20_4_ * 0.0;
  auVar105._24_4_ = auVar97._24_4_ * 0.0;
  auVar105._28_4_ = auVar97._28_4_;
  auVar97 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar175));
  auVar110._0_4_ = auVar88._0_4_ * auVar97._0_4_;
  auVar110._4_4_ = auVar88._4_4_ * auVar97._4_4_;
  auVar110._8_4_ = auVar88._8_4_ * auVar97._8_4_;
  auVar110._12_4_ = auVar88._12_4_ * auVar97._12_4_;
  auVar110._16_4_ = auVar97._16_4_ * 0.0;
  auVar110._20_4_ = auVar97._20_4_ * 0.0;
  auVar110._24_4_ = auVar97._24_4_ * 0.0;
  auVar110._28_4_ = 0;
  auVar97 = vpminsd_avx2(auVar103,auVar113);
  auVar98 = vpminsd_avx2(auVar104,auVar111);
  auVar97 = vmaxps_avx(auVar97,auVar98);
  auVar98 = vpminsd_avx2(auVar105,auVar110);
  uVar149 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar99._4_4_ = uVar149;
  auVar99._0_4_ = uVar149;
  auVar99._8_4_ = uVar149;
  auVar99._12_4_ = uVar149;
  auVar99._16_4_ = uVar149;
  auVar99._20_4_ = uVar149;
  auVar99._24_4_ = uVar149;
  auVar99._28_4_ = uVar149;
  auVar98 = vmaxps_avx512vl(auVar98,auVar99);
  auVar97 = vmaxps_avx(auVar97,auVar98);
  auVar98._8_4_ = 0x3f7ffffa;
  auVar98._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar98._12_4_ = 0x3f7ffffa;
  auVar98._16_4_ = 0x3f7ffffa;
  auVar98._20_4_ = 0x3f7ffffa;
  auVar98._24_4_ = 0x3f7ffffa;
  auVar98._28_4_ = 0x3f7ffffa;
  local_420 = vmulps_avx512vl(auVar97,auVar98);
  auVar97 = vpmaxsd_avx2(auVar103,auVar113);
  auVar98 = vpmaxsd_avx2(auVar104,auVar111);
  auVar97 = vminps_avx(auVar97,auVar98);
  auVar98 = vpmaxsd_avx2(auVar105,auVar110);
  uVar149 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar100._4_4_ = uVar149;
  auVar100._0_4_ = uVar149;
  auVar100._8_4_ = uVar149;
  auVar100._12_4_ = uVar149;
  auVar100._16_4_ = uVar149;
  auVar100._20_4_ = uVar149;
  auVar100._24_4_ = uVar149;
  auVar100._28_4_ = uVar149;
  auVar98 = vminps_avx512vl(auVar98,auVar100);
  auVar97 = vminps_avx(auVar97,auVar98);
  auVar101._8_4_ = 0x3f800003;
  auVar101._0_8_ = 0x3f8000033f800003;
  auVar101._12_4_ = 0x3f800003;
  auVar101._16_4_ = 0x3f800003;
  auVar101._20_4_ = 0x3f800003;
  auVar101._24_4_ = 0x3f800003;
  auVar101._28_4_ = 0x3f800003;
  auVar97 = vmulps_avx512vl(auVar97,auVar101);
  auVar98 = vpbroadcastd_avx512vl();
  uVar18 = vpcmpgtd_avx512vl(auVar98,_DAT_0205a920);
  uVar17 = vcmpps_avx512vl(local_420,auVar97,2);
  bVar82 = (byte)((byte)uVar17 & (byte)uVar18) == 0;
  local_9b9 = !bVar82;
  if (bVar82) {
    return local_9b9;
  }
  local_6e8 = (ulong)(byte)((byte)uVar17 & (byte)uVar18);
  local_690 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_6f0 = prim;
LAB_01e9943e:
  lVar81 = 0;
  for (uVar83 = local_6e8; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
    lVar81 = lVar81 + 1;
  }
  local_878 = (ulong)*(uint *)(local_6f0 + 2);
  pGVar5 = (context->scene->geometries).items[local_878].ptr;
  uVar83 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           (ulong)*(uint *)(local_6f0 + lVar81 * 4 + 6) *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar246 = (pGVar5->time_range).lower;
  fVar246 = pGVar5->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar246) / ((pGVar5->time_range).upper - fVar246));
  auVar85 = vroundss_avx(ZEXT416((uint)fVar246),ZEXT416((uint)fVar246),9);
  auVar85 = vminss_avx(auVar85,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar85 = vmaxss_avx(ZEXT816(0) << 0x20,auVar85);
  fVar246 = fVar246 - auVar85._0_4_;
  _Var6 = pGVar5[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar80 = (long)(int)auVar85._0_4_ * 0x38;
  lVar81 = *(long *)(_Var6 + 0x10 + lVar80);
  lVar7 = *(long *)(_Var6 + 0x38 + lVar80);
  lVar8 = *(long *)(_Var6 + 0x48 + lVar80);
  pfVar1 = (float *)(lVar7 + uVar83 * lVar8);
  auVar92._0_4_ = fVar246 * *pfVar1;
  auVar92._4_4_ = fVar246 * pfVar1[1];
  auVar92._8_4_ = fVar246 * pfVar1[2];
  auVar92._12_4_ = fVar246 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar83 + 1) * lVar8);
  auVar175._0_4_ = fVar246 * *pfVar1;
  auVar175._4_4_ = fVar246 * pfVar1[1];
  auVar175._8_4_ = fVar246 * pfVar1[2];
  auVar175._12_4_ = fVar246 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar83 + 2) * lVar8);
  auVar196._0_4_ = fVar246 * *pfVar1;
  auVar196._4_4_ = fVar246 * pfVar1[1];
  auVar196._8_4_ = fVar246 * pfVar1[2];
  auVar196._12_4_ = fVar246 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + lVar8 * (uVar83 + 3));
  auVar216._0_4_ = fVar246 * *pfVar1;
  auVar216._4_4_ = fVar246 * pfVar1[1];
  auVar216._8_4_ = fVar246 * pfVar1[2];
  auVar216._12_4_ = fVar246 * pfVar1[3];
  lVar7 = *(long *)(_Var6 + lVar80);
  fVar246 = 1.0 - fVar246;
  auVar226._4_4_ = fVar246;
  auVar226._0_4_ = fVar246;
  auVar226._8_4_ = fVar246;
  auVar226._12_4_ = fVar246;
  auVar88 = vfmadd231ps_fma(auVar92,auVar226,*(undefined1 (*) [16])(lVar7 + lVar81 * uVar83));
  auVar2 = vfmadd231ps_fma(auVar175,auVar226,*(undefined1 (*) [16])(lVar7 + lVar81 * (uVar83 + 1)));
  auVar3 = vfmadd231ps_fma(auVar196,auVar226,*(undefined1 (*) [16])(lVar7 + lVar81 * (uVar83 + 2)));
  auVar227 = vfmadd231ps_fma(auVar216,auVar226,*(undefined1 (*) [16])(lVar7 + lVar81 * (uVar83 + 3))
                            );
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar87 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar149 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar258._4_4_ = uVar149;
  auVar258._0_4_ = uVar149;
  auVar258._8_4_ = uVar149;
  auVar258._12_4_ = uVar149;
  local_4a0._16_4_ = uVar149;
  local_4a0._0_16_ = auVar258;
  local_4a0._20_4_ = uVar149;
  local_4a0._24_4_ = uVar149;
  local_4a0._28_4_ = uVar149;
  auVar261 = ZEXT3264(local_4a0);
  uVar149 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar262._4_4_ = uVar149;
  auVar262._0_4_ = uVar149;
  auVar262._8_4_ = uVar149;
  auVar262._12_4_ = uVar149;
  local_4c0._16_4_ = uVar149;
  local_4c0._0_16_ = auVar262;
  local_4c0._20_4_ = uVar149;
  local_4c0._24_4_ = uVar149;
  local_4c0._28_4_ = uVar149;
  auVar263 = ZEXT3264(local_4c0);
  auVar85 = vunpcklps_avx(auVar258,auVar262);
  fVar246 = *(float *)(ray + k * 4 + 0x60);
  auVar264._4_4_ = fVar246;
  auVar264._0_4_ = fVar246;
  auVar264._8_4_ = fVar246;
  auVar264._12_4_ = fVar246;
  local_4e0._16_4_ = fVar246;
  local_4e0._0_16_ = auVar264;
  local_4e0._20_4_ = fVar246;
  local_4e0._24_4_ = fVar246;
  local_4e0._28_4_ = fVar246;
  local_7f0 = vinsertps_avx(auVar85,auVar264,0x28);
  auVar247 = ZEXT1664(local_7f0);
  auVar239._0_4_ = auVar88._0_4_ + auVar2._0_4_ + auVar3._0_4_ + auVar227._0_4_;
  auVar239._4_4_ = auVar88._4_4_ + auVar2._4_4_ + auVar3._4_4_ + auVar227._4_4_;
  auVar239._8_4_ = auVar88._8_4_ + auVar2._8_4_ + auVar3._8_4_ + auVar227._8_4_;
  auVar239._12_4_ = auVar88._12_4_ + auVar2._12_4_ + auVar3._12_4_ + auVar227._12_4_;
  auVar91._8_4_ = 0x3e800000;
  auVar91._0_8_ = 0x3e8000003e800000;
  auVar91._12_4_ = 0x3e800000;
  auVar85 = vmulps_avx512vl(auVar239,auVar91);
  auVar85 = vsubps_avx(auVar85,auVar87);
  auVar85 = vdpps_avx(auVar85,local_7f0,0x7f);
  fVar148 = *(float *)(ray + k * 4 + 0x30);
  auVar255 = ZEXT464((uint)fVar148);
  local_800 = vdpps_avx(local_7f0,local_7f0,0x7f);
  local_670 = vpbroadcastd_avx512vl();
  auVar242._4_12_ = ZEXT812(0) << 0x20;
  auVar242._0_4_ = local_800._0_4_;
  auVar86 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar242);
  auVar89 = vfnmadd213ss_fma(auVar86,local_800,ZEXT416(0x40000000));
  local_220 = auVar85._0_4_ * auVar86._0_4_ * auVar89._0_4_;
  auVar240 = ZEXT464((uint)local_220);
  auVar243._4_4_ = local_220;
  auVar243._0_4_ = local_220;
  auVar243._8_4_ = local_220;
  auVar243._12_4_ = local_220;
  fStack_5b0 = local_220;
  _local_5c0 = auVar243;
  fStack_5ac = local_220;
  fStack_5a8 = local_220;
  fStack_5a4 = local_220;
  auVar85 = vfmadd231ps_fma(auVar87,local_7f0,auVar243);
  auVar85 = vblendps_avx(auVar85,ZEXT816(0) << 0x40,8);
  auVar87 = vsubps_avx(auVar88,auVar85);
  auVar88 = vsubps_avx(auVar3,auVar85);
  auVar2 = vsubps_avx(auVar2,auVar85);
  auVar245 = ZEXT1664(auVar2);
  auVar85 = vsubps_avx(auVar227,auVar85);
  local_240 = vbroadcastss_avx512vl(auVar87);
  auVar120._8_4_ = 1;
  auVar120._0_8_ = 0x100000001;
  auVar120._12_4_ = 1;
  auVar120._16_4_ = 1;
  auVar120._20_4_ = 1;
  auVar120._24_4_ = 1;
  auVar120._28_4_ = 1;
  local_780 = ZEXT1632(auVar87);
  local_260 = vpermps_avx512vl(auVar120,local_780);
  auVar123._8_4_ = 2;
  auVar123._0_8_ = 0x200000002;
  auVar123._12_4_ = 2;
  auVar123._16_4_ = 2;
  auVar123._20_4_ = 2;
  auVar123._24_4_ = 2;
  auVar123._28_4_ = 2;
  local_280 = vpermps_avx512vl(auVar123,local_780);
  auVar124._8_4_ = 3;
  auVar124._0_8_ = 0x300000003;
  auVar124._12_4_ = 3;
  auVar124._16_4_ = 3;
  auVar124._20_4_ = 3;
  auVar124._24_4_ = 3;
  auVar124._28_4_ = 3;
  local_1e0 = vpermps_avx2(auVar124,local_780);
  local_2a0 = vbroadcastss_avx512vl(auVar2);
  local_7c0 = ZEXT1632(auVar2);
  local_2c0 = vpermps_avx512vl(auVar120,local_7c0);
  local_2e0 = vpermps_avx512vl(auVar123,local_7c0);
  local_300 = vpermps_avx512vl(auVar124,local_7c0);
  local_320 = vbroadcastss_avx512vl(auVar88);
  local_7a0 = ZEXT1632(auVar88);
  local_340 = vpermps_avx512vl(auVar120,local_7a0);
  local_360 = vpermps_avx512vl(auVar123,local_7a0);
  local_380 = vpermps_avx512vl(auVar124,local_7a0);
  local_3a0 = vbroadcastss_avx512vl(auVar85);
  _local_7e0 = ZEXT1632(auVar85);
  local_3c0 = vpermps_avx512vl(auVar120,_local_7e0);
  local_500 = vpermps_avx512vl(auVar123,_local_7e0);
  local_400 = vpermps_avx2(auVar124,_local_7e0);
  auVar85 = vfmadd231ps_fma(ZEXT432((uint)(fVar246 * fVar246)),local_4c0,local_4c0);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),local_4a0,local_4a0);
  uVar149 = auVar85._0_4_;
  local_200._4_4_ = uVar149;
  local_200._0_4_ = uVar149;
  local_200._8_4_ = uVar149;
  local_200._12_4_ = uVar149;
  local_200._16_4_ = uVar149;
  local_200._20_4_ = uVar149;
  local_200._24_4_ = uVar149;
  local_200._28_4_ = uVar149;
  vandps_avx512vl(local_200,auVar265._0_32_);
  local_750 = ZEXT416((uint)local_220);
  local_220 = fVar148 - local_220;
  fStack_21c = local_220;
  fStack_218 = local_220;
  fStack_214 = local_220;
  fStack_210 = local_220;
  fStack_20c = local_220;
  fStack_208 = local_220;
  fStack_204 = local_220;
  bVar78 = 0;
  local_888 = 1;
  local_680 = vpbroadcastd_avx512vl();
  auVar85 = vsqrtss_avx(local_800,local_800);
  local_8c4 = auVar85._0_4_;
  auVar85 = vsqrtss_avx(local_800,local_800);
  local_8c8 = auVar85._0_4_;
  auVar211 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  local_3e0 = local_500;
  local_880 = 0;
  do {
    local_8a0 = auVar211._0_16_;
    auVar85 = vmovshdup_avx(local_8a0);
    fVar246 = auVar211._0_4_;
    fVar195 = auVar85._0_4_ - fVar246;
    fVar238 = fVar195 * 0.04761905;
    auVar232._4_4_ = fVar246;
    auVar232._0_4_ = fVar246;
    auVar232._8_4_ = fVar246;
    auVar232._12_4_ = fVar246;
    auVar232._16_4_ = fVar246;
    auVar232._20_4_ = fVar246;
    auVar232._24_4_ = fVar246;
    auVar232._28_4_ = fVar246;
    local_820._4_4_ = fVar195;
    local_820._0_4_ = fVar195;
    local_820._8_4_ = fVar195;
    local_820._12_4_ = fVar195;
    local_820._16_4_ = fVar195;
    local_820._20_4_ = fVar195;
    local_820._24_4_ = fVar195;
    local_820._28_4_ = fVar195;
    auVar85 = vfmadd231ps_fma(auVar232,local_820,_DAT_02020f20);
    auVar97 = vsubps_avx(auVar225._0_32_,ZEXT1632(auVar85));
    fVar246 = auVar97._0_4_;
    fVar249 = auVar97._4_4_;
    fVar251 = auVar97._8_4_;
    fVar253 = auVar97._12_4_;
    fVar215 = auVar97._16_4_;
    fVar237 = auVar97._20_4_;
    fVar254 = auVar97._24_4_;
    fVar150 = fVar246 * fVar246 * fVar246;
    fVar168 = fVar249 * fVar249 * fVar249;
    auVar37._4_4_ = fVar168;
    auVar37._0_4_ = fVar150;
    fVar169 = fVar251 * fVar251 * fVar251;
    auVar37._8_4_ = fVar169;
    fVar170 = fVar253 * fVar253 * fVar253;
    auVar37._12_4_ = fVar170;
    fVar171 = fVar215 * fVar215 * fVar215;
    auVar37._16_4_ = fVar171;
    fVar172 = fVar237 * fVar237 * fVar237;
    auVar37._20_4_ = fVar172;
    fVar174 = fVar254 * fVar254 * fVar254;
    auVar37._24_4_ = fVar174;
    auVar37._28_4_ = fVar195;
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar99 = vmulps_avx512vl(auVar37,auVar98);
    fVar248 = auVar85._0_4_;
    fVar250 = auVar85._4_4_;
    fVar252 = auVar85._8_4_;
    fVar173 = auVar85._12_4_;
    fVar194 = fVar248 * fVar248 * fVar248;
    fVar212 = fVar250 * fVar250 * fVar250;
    fVar213 = fVar252 * fVar252 * fVar252;
    fVar214 = fVar173 * fVar173 * fVar173;
    auVar265._28_36_ = auVar211._28_36_;
    auVar265._0_28_ = ZEXT1628(CONCAT412(fVar214,CONCAT48(fVar213,CONCAT44(fVar212,fVar194))));
    auVar211._0_4_ = fVar248 * fVar246;
    auVar211._4_4_ = fVar250 * fVar249;
    auVar211._8_4_ = fVar252 * fVar251;
    auVar211._12_4_ = fVar173 * fVar253;
    auVar211._16_4_ = fVar215 * 0.0;
    auVar211._20_4_ = fVar237 * 0.0;
    auVar211._28_36_ = auVar255._28_36_;
    auVar211._24_4_ = fVar254 * 0.0;
    auVar100 = vmulps_avx512vl(auVar265._0_32_,auVar98);
    fVar257 = auVar100._28_4_ + fVar195;
    fVar241 = fVar257 + auVar261._28_4_ + auVar240._28_4_;
    auVar38._4_4_ = fVar168 * 0.16666667;
    auVar38._0_4_ = fVar150 * 0.16666667;
    auVar38._8_4_ = fVar169 * 0.16666667;
    auVar38._12_4_ = fVar170 * 0.16666667;
    auVar38._16_4_ = fVar171 * 0.16666667;
    auVar38._20_4_ = fVar172 * 0.16666667;
    auVar38._24_4_ = fVar174 * 0.16666667;
    auVar38._28_4_ = fVar257;
    auVar39._4_4_ =
         (auVar211._4_4_ * fVar249 * 12.0 + auVar211._4_4_ * fVar250 * 6.0 + fVar212 + auVar99._4_4_
         ) * 0.16666667;
    auVar39._0_4_ =
         (auVar211._0_4_ * fVar246 * 12.0 + auVar211._0_4_ * fVar248 * 6.0 + fVar194 + auVar99._0_4_
         ) * 0.16666667;
    auVar39._8_4_ =
         (auVar211._8_4_ * fVar251 * 12.0 + auVar211._8_4_ * fVar252 * 6.0 + fVar213 + auVar99._8_4_
         ) * 0.16666667;
    auVar39._12_4_ =
         (auVar211._12_4_ * fVar253 * 12.0 + auVar211._12_4_ * fVar173 * 6.0 +
         fVar214 + auVar99._12_4_) * 0.16666667;
    auVar39._16_4_ =
         (auVar211._16_4_ * fVar215 * 12.0 + auVar211._16_4_ * 0.0 * 6.0 + auVar99._16_4_ + 0.0) *
         0.16666667;
    auVar39._20_4_ =
         (auVar211._20_4_ * fVar237 * 12.0 + auVar211._20_4_ * 0.0 * 6.0 + auVar99._20_4_ + 0.0) *
         0.16666667;
    auVar39._24_4_ =
         (auVar211._24_4_ * fVar254 * 12.0 + auVar211._24_4_ * 0.0 * 6.0 + auVar99._24_4_ + 0.0) *
         0.16666667;
    auVar39._28_4_ = auVar261._28_4_;
    auVar40._4_4_ =
         (auVar100._4_4_ + fVar168 +
         auVar211._4_4_ * fVar250 * 12.0 + auVar211._4_4_ * fVar249 * 6.0) * 0.16666667;
    auVar40._0_4_ =
         (auVar100._0_4_ + fVar150 +
         auVar211._0_4_ * fVar248 * 12.0 + auVar211._0_4_ * fVar246 * 6.0) * 0.16666667;
    auVar40._8_4_ =
         (auVar100._8_4_ + fVar169 +
         auVar211._8_4_ * fVar252 * 12.0 + auVar211._8_4_ * fVar251 * 6.0) * 0.16666667;
    auVar40._12_4_ =
         (auVar100._12_4_ + fVar170 +
         auVar211._12_4_ * fVar173 * 12.0 + auVar211._12_4_ * fVar253 * 6.0) * 0.16666667;
    auVar40._16_4_ =
         (auVar100._16_4_ + fVar171 + auVar211._16_4_ * 0.0 * 12.0 + auVar211._16_4_ * fVar215 * 6.0
         ) * 0.16666667;
    auVar40._20_4_ =
         (auVar100._20_4_ + fVar172 + auVar211._20_4_ * 0.0 * 12.0 + auVar211._20_4_ * fVar237 * 6.0
         ) * 0.16666667;
    auVar40._24_4_ =
         (auVar100._24_4_ + fVar174 + auVar211._24_4_ * 0.0 * 12.0 + auVar211._24_4_ * fVar254 * 6.0
         ) * 0.16666667;
    auVar40._28_4_ = auVar263._28_4_;
    auVar41._28_4_ = fVar241;
    auVar41._0_28_ =
         ZEXT1628(CONCAT412(fVar214 * 0.16666667,
                            CONCAT48(fVar213 * 0.16666667,
                                     CONCAT44(fVar212 * 0.16666667,fVar194 * 0.16666667))));
    auVar99 = vmulps_avx512vl(local_3a0,auVar41);
    auVar100 = vmulps_avx512vl(local_3c0,auVar41);
    auVar101 = vmulps_avx512vl(local_3e0,auVar41);
    auVar42._4_4_ = local_400._4_4_ * fVar212 * 0.16666667;
    auVar42._0_4_ = local_400._0_4_ * fVar194 * 0.16666667;
    auVar42._8_4_ = local_400._8_4_ * fVar213 * 0.16666667;
    auVar42._12_4_ = local_400._12_4_ * fVar214 * 0.16666667;
    auVar42._16_4_ = local_400._16_4_ * 0.0;
    auVar42._20_4_ = local_400._20_4_ * 0.0;
    auVar42._24_4_ = local_400._24_4_ * 0.0;
    auVar42._28_4_ = fVar241;
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar40,local_320);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar40,local_340);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar40,local_360);
    auVar102 = vfmadd231ps_avx512vl(auVar42,local_380,auVar40);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar39,local_2a0);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar39,local_2c0);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar39,local_2e0);
    auVar102 = vfmadd231ps_avx512vl(auVar102,local_300,auVar39);
    auVar103 = vfmadd231ps_avx512vl(auVar99,auVar38,local_240);
    auVar104 = vfmadd231ps_avx512vl(auVar100,auVar38,local_260);
    local_840 = vfmadd231ps_avx512vl(auVar101,auVar38,local_280);
    auVar87 = vfmadd231ps_fma(auVar102,local_1e0,auVar38);
    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar100 = vxorps_avx512vl(auVar97,auVar99);
    auVar99 = vxorps_avx512vl(ZEXT1632(auVar85),auVar99);
    auVar233._0_4_ = auVar99._0_4_ * fVar248;
    auVar233._4_4_ = auVar99._4_4_ * fVar250;
    auVar233._8_4_ = auVar99._8_4_ * fVar252;
    auVar233._12_4_ = auVar99._12_4_ * fVar173;
    auVar233._16_4_ = auVar99._16_4_ * 0.0;
    auVar233._20_4_ = auVar99._20_4_ * 0.0;
    auVar233._24_4_ = auVar99._24_4_ * 0.0;
    auVar233._28_4_ = 0;
    auVar101 = vmulps_avx512vl(auVar211._0_32_,auVar98);
    auVar98 = vsubps_avx(auVar233,auVar101);
    auVar43._4_4_ = auVar100._4_4_ * fVar249 * 0.5;
    auVar43._0_4_ = auVar100._0_4_ * fVar246 * 0.5;
    auVar43._8_4_ = auVar100._8_4_ * fVar251 * 0.5;
    auVar43._12_4_ = auVar100._12_4_ * fVar253 * 0.5;
    auVar43._16_4_ = auVar100._16_4_ * fVar215 * 0.5;
    auVar43._20_4_ = auVar100._20_4_ * fVar237 * 0.5;
    auVar43._24_4_ = auVar100._24_4_ * fVar254 * 0.5;
    auVar43._28_4_ = auVar97._28_4_;
    auVar44._4_4_ = auVar98._4_4_ * 0.5;
    auVar44._0_4_ = auVar98._0_4_ * 0.5;
    auVar44._8_4_ = auVar98._8_4_ * 0.5;
    auVar44._12_4_ = auVar98._12_4_ * 0.5;
    auVar44._16_4_ = auVar98._16_4_ * 0.5;
    auVar44._20_4_ = auVar98._20_4_ * 0.5;
    auVar44._24_4_ = auVar98._24_4_ * 0.5;
    auVar44._28_4_ = auVar98._28_4_;
    auVar45._4_4_ = (fVar249 * fVar249 + auVar101._4_4_) * 0.5;
    auVar45._0_4_ = (fVar246 * fVar246 + auVar101._0_4_) * 0.5;
    auVar45._8_4_ = (fVar251 * fVar251 + auVar101._8_4_) * 0.5;
    auVar45._12_4_ = (fVar253 * fVar253 + auVar101._12_4_) * 0.5;
    auVar45._16_4_ = (fVar215 * fVar215 + auVar101._16_4_) * 0.5;
    auVar45._20_4_ = (fVar237 * fVar237 + auVar101._20_4_) * 0.5;
    auVar45._24_4_ = (fVar254 * fVar254 + auVar101._24_4_) * 0.5;
    auVar45._28_4_ = auVar245._28_4_ + auVar101._28_4_;
    fVar246 = fVar248 * fVar248 * 0.5;
    fVar248 = fVar250 * fVar250 * 0.5;
    fVar249 = fVar252 * fVar252 * 0.5;
    fVar250 = fVar173 * fVar173 * 0.5;
    auVar46._28_4_ = auVar247._28_4_;
    auVar46._0_28_ = ZEXT1628(CONCAT412(fVar250,CONCAT48(fVar249,CONCAT44(fVar248,fVar246))));
    auVar97 = vmulps_avx512vl(local_3a0,auVar46);
    auVar98 = vmulps_avx512vl(local_3c0,auVar46);
    auVar100 = vmulps_avx512vl(local_3e0,auVar46);
    auVar47._4_4_ = fVar248 * local_400._4_4_;
    auVar47._0_4_ = fVar246 * local_400._0_4_;
    auVar47._8_4_ = fVar249 * local_400._8_4_;
    auVar47._12_4_ = fVar250 * local_400._12_4_;
    auVar47._16_4_ = local_400._16_4_ * 0.0;
    auVar47._20_4_ = local_400._20_4_ * 0.0;
    auVar47._24_4_ = local_400._24_4_ * 0.0;
    auVar47._28_4_ = auVar247._28_4_;
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar45,local_320);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar45,local_340);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar45,local_360);
    auVar101 = vfmadd231ps_avx512vl(auVar47,local_380,auVar45);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar44,local_2a0);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar44,local_2c0);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar44,local_2e0);
    auVar101 = vfmadd231ps_avx512vl(auVar101,local_300,auVar44);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar43,local_240);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar43,local_260);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar43,local_280);
    auVar85 = vfmadd231ps_fma(auVar101,local_1e0,auVar43);
    auVar48._4_4_ = auVar97._4_4_ * fVar238;
    auVar48._0_4_ = auVar97._0_4_ * fVar238;
    auVar48._8_4_ = auVar97._8_4_ * fVar238;
    auVar48._12_4_ = auVar97._12_4_ * fVar238;
    auVar48._16_4_ = auVar97._16_4_ * fVar238;
    auVar48._20_4_ = auVar97._20_4_ * fVar238;
    auVar48._24_4_ = auVar97._24_4_ * fVar238;
    auVar48._28_4_ = auVar99._28_4_;
    auVar49._4_4_ = auVar98._4_4_ * fVar238;
    auVar49._0_4_ = auVar98._0_4_ * fVar238;
    auVar49._8_4_ = auVar98._8_4_ * fVar238;
    auVar49._12_4_ = auVar98._12_4_ * fVar238;
    auVar49._16_4_ = auVar98._16_4_ * fVar238;
    auVar49._20_4_ = auVar98._20_4_ * fVar238;
    auVar49._24_4_ = auVar98._24_4_ * fVar238;
    auVar49._28_4_ = auVar98._28_4_;
    auVar261 = ZEXT3264(auVar49);
    auVar50._4_4_ = auVar100._4_4_ * fVar238;
    auVar50._0_4_ = auVar100._0_4_ * fVar238;
    auVar50._8_4_ = auVar100._8_4_ * fVar238;
    auVar50._12_4_ = auVar100._12_4_ * fVar238;
    auVar50._16_4_ = auVar100._16_4_ * fVar238;
    auVar50._20_4_ = auVar100._20_4_ * fVar238;
    auVar50._24_4_ = auVar100._24_4_ * fVar238;
    auVar50._28_4_ = auVar100._28_4_;
    auVar263 = ZEXT3264(auVar50);
    fVar246 = auVar85._0_4_ * fVar238;
    fVar248 = auVar85._4_4_ * fVar238;
    auVar51._4_4_ = fVar248;
    auVar51._0_4_ = fVar246;
    fVar249 = auVar85._8_4_ * fVar238;
    auVar51._8_4_ = fVar249;
    fVar250 = auVar85._12_4_ * fVar238;
    auVar51._12_4_ = fVar250;
    auVar51._16_4_ = fVar238 * 0.0;
    auVar51._20_4_ = fVar238 * 0.0;
    auVar51._24_4_ = fVar238 * 0.0;
    auVar51._28_4_ = local_400._28_4_;
    auVar85 = vxorps_avx512vl(local_380._0_16_,local_380._0_16_);
    auVar102 = vpermt2ps_avx512vl(auVar103,_DAT_0205fd20,ZEXT1632(auVar85));
    auVar245 = ZEXT3264(auVar102);
    auVar105 = vpermt2ps_avx512vl(auVar104,_DAT_0205fd20,ZEXT1632(auVar85));
    auVar247 = ZEXT3264(auVar105);
    auVar99 = ZEXT1632(auVar85);
    auVar106 = vpermt2ps_avx512vl(local_840,_DAT_0205fd20,auVar99);
    auVar255 = ZEXT3264(auVar106);
    auVar234._0_4_ = fVar246 + auVar87._0_4_;
    auVar234._4_4_ = fVar248 + auVar87._4_4_;
    auVar234._8_4_ = fVar249 + auVar87._8_4_;
    auVar234._12_4_ = fVar250 + auVar87._12_4_;
    auVar234._16_4_ = fVar238 * 0.0 + 0.0;
    auVar234._20_4_ = fVar238 * 0.0 + 0.0;
    auVar234._24_4_ = fVar238 * 0.0 + 0.0;
    auVar234._28_4_ = local_400._28_4_ + 0.0;
    auVar97 = vmaxps_avx(ZEXT1632(auVar87),auVar234);
    auVar98 = vminps_avx(ZEXT1632(auVar87),auVar234);
    auVar96 = vpermt2ps_avx512vl(ZEXT1632(auVar87),_DAT_0205fd20,auVar99);
    auVar107 = vpermt2ps_avx512vl(auVar48,_DAT_0205fd20,auVar99);
    auVar108 = vpermt2ps_avx512vl(auVar49,_DAT_0205fd20,auVar99);
    auVar119 = ZEXT1632(auVar85);
    auVar94 = vpermt2ps_avx512vl(auVar50,_DAT_0205fd20,auVar119);
    auVar99 = vpermt2ps_avx512vl(auVar51,_DAT_0205fd20,auVar119);
    auVar95 = vsubps_avx512vl(auVar96,auVar99);
    auVar99 = vsubps_avx(auVar102,auVar103);
    auVar100 = vsubps_avx(auVar105,auVar104);
    auVar101 = vsubps_avx(auVar106,local_840);
    auVar240 = ZEXT3264(auVar101);
    auVar109 = vmulps_avx512vl(auVar100,auVar50);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar49,auVar101);
    auVar110 = vmulps_avx512vl(auVar101,auVar48);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar50,auVar99);
    auVar111 = vmulps_avx512vl(auVar99,auVar49);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar48,auVar100);
    auVar111 = vmulps_avx512vl(auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar110 = vmulps_avx512vl(auVar101,auVar101);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar100,auVar100);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar99,auVar99);
    auVar111 = vrcp14ps_avx512vl(auVar110);
    auVar112 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar113 = vfnmadd213ps_avx512vl(auVar111,auVar110,auVar112);
    auVar111 = vfmadd132ps_avx512vl(auVar113,auVar111,auVar111);
    auVar109 = vmulps_avx512vl(auVar109,auVar111);
    auVar113 = vmulps_avx512vl(auVar100,auVar94);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar108,auVar101);
    auVar114 = vmulps_avx512vl(auVar101,auVar107);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar94,auVar99);
    auVar115 = vmulps_avx512vl(auVar99,auVar108);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar107,auVar100);
    auVar115 = vmulps_avx512vl(auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar111 = vmulps_avx512vl(auVar113,auVar111);
    auVar109 = vmaxps_avx512vl(auVar109,auVar111);
    auVar109 = vsqrtps_avx512vl(auVar109);
    auVar111 = vmaxps_avx512vl(auVar95,auVar96);
    auVar97 = vmaxps_avx512vl(auVar97,auVar111);
    auVar111 = vaddps_avx512vl(auVar109,auVar97);
    auVar97 = vminps_avx512vl(auVar95,auVar96);
    auVar97 = vminps_avx(auVar98,auVar97);
    auVar97 = vsubps_avx512vl(auVar97,auVar109);
    auVar125._8_4_ = 0x3f800002;
    auVar125._0_8_ = 0x3f8000023f800002;
    auVar125._12_4_ = 0x3f800002;
    auVar125._16_4_ = 0x3f800002;
    auVar125._20_4_ = 0x3f800002;
    auVar125._24_4_ = 0x3f800002;
    auVar125._28_4_ = 0x3f800002;
    auVar98 = vmulps_avx512vl(auVar111,auVar125);
    auVar126._8_4_ = 0x3f7ffffc;
    auVar126._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar126._12_4_ = 0x3f7ffffc;
    auVar126._16_4_ = 0x3f7ffffc;
    auVar126._20_4_ = 0x3f7ffffc;
    auVar126._24_4_ = 0x3f7ffffc;
    auVar126._28_4_ = 0x3f7ffffc;
    auVar97 = vmulps_avx512vl(auVar97,auVar126);
    auVar52._4_4_ = auVar98._4_4_ * auVar98._4_4_;
    auVar52._0_4_ = auVar98._0_4_ * auVar98._0_4_;
    auVar52._8_4_ = auVar98._8_4_ * auVar98._8_4_;
    auVar52._12_4_ = auVar98._12_4_ * auVar98._12_4_;
    auVar52._16_4_ = auVar98._16_4_ * auVar98._16_4_;
    auVar52._20_4_ = auVar98._20_4_ * auVar98._20_4_;
    auVar52._24_4_ = auVar98._24_4_ * auVar98._24_4_;
    auVar52._28_4_ = auVar97._28_4_;
    auVar98 = vrsqrt14ps_avx512vl(auVar110);
    auVar23._8_4_ = 0xbf000000;
    auVar23._0_8_ = 0xbf000000bf000000;
    auVar23._12_4_ = 0xbf000000;
    auVar23._16_4_ = 0xbf000000;
    auVar23._20_4_ = 0xbf000000;
    auVar23._24_4_ = 0xbf000000;
    auVar23._28_4_ = 0xbf000000;
    auVar96 = vmulps_avx512vl(auVar110,auVar23);
    auVar53._4_4_ = auVar98._4_4_ * auVar96._4_4_;
    auVar53._0_4_ = auVar98._0_4_ * auVar96._0_4_;
    auVar53._8_4_ = auVar98._8_4_ * auVar96._8_4_;
    auVar53._12_4_ = auVar98._12_4_ * auVar96._12_4_;
    auVar53._16_4_ = auVar98._16_4_ * auVar96._16_4_;
    auVar53._20_4_ = auVar98._20_4_ * auVar96._20_4_;
    auVar53._24_4_ = auVar98._24_4_ * auVar96._24_4_;
    auVar53._28_4_ = auVar96._28_4_;
    auVar96 = vmulps_avx512vl(auVar98,auVar98);
    auVar96 = vmulps_avx512vl(auVar96,auVar53);
    auVar24._8_4_ = 0x3fc00000;
    auVar24._0_8_ = 0x3fc000003fc00000;
    auVar24._12_4_ = 0x3fc00000;
    auVar24._16_4_ = 0x3fc00000;
    auVar24._20_4_ = 0x3fc00000;
    auVar24._24_4_ = 0x3fc00000;
    auVar24._28_4_ = 0x3fc00000;
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar98,auVar24);
    auVar54._4_4_ = auVar96._4_4_ * auVar99._4_4_;
    auVar54._0_4_ = auVar96._0_4_ * auVar99._0_4_;
    auVar54._8_4_ = auVar96._8_4_ * auVar99._8_4_;
    auVar54._12_4_ = auVar96._12_4_ * auVar99._12_4_;
    auVar54._16_4_ = auVar96._16_4_ * auVar99._16_4_;
    auVar54._20_4_ = auVar96._20_4_ * auVar99._20_4_;
    auVar54._24_4_ = auVar96._24_4_ * auVar99._24_4_;
    auVar54._28_4_ = auVar98._28_4_;
    auVar98 = vmulps_avx512vl(auVar100,auVar96);
    auVar95 = vmulps_avx512vl(auVar101,auVar96);
    auVar109 = vsubps_avx512vl(auVar119,auVar103);
    auVar110 = vsubps_avx512vl(auVar119,auVar104);
    auVar111 = vsubps_avx512vl(auVar119,local_840);
    auVar113 = vmulps_avx512vl(local_4e0,auVar111);
    auVar113 = vfmadd231ps_avx512vl(auVar113,local_4c0,auVar110);
    auVar113 = vfmadd231ps_avx512vl(auVar113,local_4a0,auVar109);
    auVar114 = vmulps_avx512vl(auVar111,auVar111);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar110,auVar110);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar109,auVar109);
    auVar115 = vmulps_avx512vl(local_4e0,auVar95);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar98,local_4c0);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar54,local_4a0);
    auVar95 = vmulps_avx512vl(auVar111,auVar95);
    auVar98 = vfmadd231ps_avx512vl(auVar95,auVar110,auVar98);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar109,auVar54);
    local_6c0 = vmulps_avx512vl(auVar115,auVar115);
    auVar95 = vsubps_avx512vl(local_200,local_6c0);
    auVar116 = vmulps_avx512vl(auVar115,auVar98);
    auVar113 = vsubps_avx512vl(auVar113,auVar116);
    auVar113 = vaddps_avx512vl(auVar113,auVar113);
    auVar116 = vmulps_avx512vl(auVar98,auVar98);
    local_8c0 = vsubps_avx512vl(auVar114,auVar116);
    auVar114 = vsubps_avx512vl(local_8c0,auVar52);
    auVar116 = vmulps_avx512vl(auVar113,auVar113);
    auVar25._8_4_ = 0x40800000;
    auVar25._0_8_ = 0x4080000040800000;
    auVar25._12_4_ = 0x40800000;
    auVar25._16_4_ = 0x40800000;
    auVar25._20_4_ = 0x40800000;
    auVar25._24_4_ = 0x40800000;
    auVar25._28_4_ = 0x40800000;
    auVar117 = vmulps_avx512vl(auVar95,auVar25);
    auVar118 = vmulps_avx512vl(auVar117,auVar114);
    auVar118 = vsubps_avx512vl(auVar116,auVar118);
    uVar83 = vcmpps_avx512vl(auVar118,auVar119,5);
    bVar74 = (byte)uVar83;
    if (bVar74 == 0) {
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar118 = vsqrtps_avx512vl(auVar118);
      auVar119 = vaddps_avx512vl(auVar95,auVar95);
      auVar120 = vrcp14ps_avx512vl(auVar119);
      auVar119 = vfnmadd213ps_avx512vl(auVar119,auVar120,auVar112);
      auVar119 = vfmadd132ps_avx512vl(auVar119,auVar120,auVar120);
      auVar26._8_4_ = 0x80000000;
      auVar26._0_8_ = 0x8000000080000000;
      auVar26._12_4_ = 0x80000000;
      auVar26._16_4_ = 0x80000000;
      auVar26._20_4_ = 0x80000000;
      auVar26._24_4_ = 0x80000000;
      auVar26._28_4_ = 0x80000000;
      auVar120 = vxorps_avx512vl(auVar113,auVar26);
      auVar120 = vsubps_avx512vl(auVar120,auVar118);
      auVar120 = vmulps_avx512vl(auVar120,auVar119);
      auVar118 = vsubps_avx512vl(auVar118,auVar113);
      auVar118 = vmulps_avx512vl(auVar118,auVar119);
      auVar119 = vfmadd213ps_avx512vl(auVar115,auVar120,auVar98);
      local_540 = vmulps_avx512vl(auVar96,auVar119);
      auVar119 = vfmadd213ps_avx512vl(auVar115,auVar118,auVar98);
      local_560 = vmulps_avx512vl(auVar96,auVar119);
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar119 = vblendmps_avx512vl(auVar119,auVar120);
      auVar121._0_4_ =
           (uint)(bVar74 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar74 & 1) * local_560._0_4_;
      bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar121._4_4_ = (uint)bVar82 * auVar119._4_4_ | (uint)!bVar82 * local_560._4_4_;
      bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar121._8_4_ = (uint)bVar82 * auVar119._8_4_ | (uint)!bVar82 * local_560._8_4_;
      bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar121._12_4_ = (uint)bVar82 * auVar119._12_4_ | (uint)!bVar82 * local_560._12_4_;
      bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
      auVar121._16_4_ = (uint)bVar82 * auVar119._16_4_ | (uint)!bVar82 * local_560._16_4_;
      bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
      auVar121._20_4_ = (uint)bVar82 * auVar119._20_4_ | (uint)!bVar82 * local_560._20_4_;
      bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
      auVar121._24_4_ = (uint)bVar82 * auVar119._24_4_ | (uint)!bVar82 * local_560._24_4_;
      bVar82 = SUB81(uVar83 >> 7,0);
      auVar121._28_4_ = (uint)bVar82 * auVar119._28_4_ | (uint)!bVar82 * local_560._28_4_;
      auVar221._8_4_ = 0xff800000;
      auVar221._0_8_ = 0xff800000ff800000;
      auVar221._12_4_ = 0xff800000;
      auVar221._16_4_ = 0xff800000;
      auVar221._20_4_ = 0xff800000;
      auVar221._24_4_ = 0xff800000;
      auVar221._28_4_ = 0xff800000;
      auVar119 = vblendmps_avx512vl(auVar221,auVar118);
      auVar122._0_4_ =
           (uint)(bVar74 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar118._0_4_;
      bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar82 * auVar119._4_4_ | (uint)!bVar82 * auVar118._4_4_;
      bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar82 * auVar119._8_4_ | (uint)!bVar82 * auVar118._8_4_;
      bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar82 * auVar119._12_4_ | (uint)!bVar82 * auVar118._12_4_;
      bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
      auVar122._16_4_ = (uint)bVar82 * auVar119._16_4_ | (uint)!bVar82 * auVar118._16_4_;
      bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
      auVar122._20_4_ = (uint)bVar82 * auVar119._20_4_ | (uint)!bVar82 * auVar118._20_4_;
      bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
      auVar122._24_4_ = (uint)bVar82 * auVar119._24_4_ | (uint)!bVar82 * auVar118._24_4_;
      bVar82 = SUB81(uVar83 >> 7,0);
      auVar122._28_4_ = (uint)bVar82 * auVar119._28_4_ | (uint)!bVar82 * auVar118._28_4_;
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(local_6c0,auVar118);
      auVar119 = vmaxps_avx512vl(local_500,auVar118);
      auVar27._8_4_ = 0x36000000;
      auVar27._0_8_ = 0x3600000036000000;
      auVar27._12_4_ = 0x36000000;
      auVar27._16_4_ = 0x36000000;
      auVar27._20_4_ = 0x36000000;
      auVar27._24_4_ = 0x36000000;
      auVar27._28_4_ = 0x36000000;
      auVar119 = vmulps_avx512vl(auVar119,auVar27);
      vandps_avx512vl(auVar95,auVar118);
      uVar76 = vcmpps_avx512vl(auVar119,auVar119,1);
      uVar83 = uVar83 & uVar76;
      bVar79 = (byte)uVar83;
      if (bVar79 != 0) {
        uVar76 = vcmpps_avx512vl(auVar114,_DAT_02020f00,2);
        auVar236._8_4_ = 0xff800000;
        auVar236._0_8_ = 0xff800000ff800000;
        auVar236._12_4_ = 0xff800000;
        auVar236._16_4_ = 0xff800000;
        auVar236._20_4_ = 0xff800000;
        auVar236._24_4_ = 0xff800000;
        auVar236._28_4_ = 0xff800000;
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar118 = vblendmps_avx512vl(auVar114,auVar236);
        bVar77 = (byte)uVar76;
        uVar84 = (uint)(bVar77 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar119._0_4_;
        bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
        uVar141 = (uint)bVar82 * auVar118._4_4_ | (uint)!bVar82 * auVar119._4_4_;
        bVar82 = (bool)((byte)(uVar76 >> 2) & 1);
        uVar142 = (uint)bVar82 * auVar118._8_4_ | (uint)!bVar82 * auVar119._8_4_;
        bVar82 = (bool)((byte)(uVar76 >> 3) & 1);
        uVar143 = (uint)bVar82 * auVar118._12_4_ | (uint)!bVar82 * auVar119._12_4_;
        bVar82 = (bool)((byte)(uVar76 >> 4) & 1);
        uVar144 = (uint)bVar82 * auVar118._16_4_ | (uint)!bVar82 * auVar119._16_4_;
        bVar82 = (bool)((byte)(uVar76 >> 5) & 1);
        uVar145 = (uint)bVar82 * auVar118._20_4_ | (uint)!bVar82 * auVar119._20_4_;
        bVar82 = (bool)((byte)(uVar76 >> 6) & 1);
        uVar146 = (uint)bVar82 * auVar118._24_4_ | (uint)!bVar82 * auVar119._24_4_;
        bVar82 = SUB81(uVar76 >> 7,0);
        uVar147 = (uint)bVar82 * auVar118._28_4_ | (uint)!bVar82 * auVar119._28_4_;
        auVar121._0_4_ = (bVar79 & 1) * uVar84 | !(bool)(bVar79 & 1) * auVar121._0_4_;
        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar121._4_4_ = bVar82 * uVar141 | !bVar82 * auVar121._4_4_;
        bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar121._8_4_ = bVar82 * uVar142 | !bVar82 * auVar121._8_4_;
        bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar121._12_4_ = bVar82 * uVar143 | !bVar82 * auVar121._12_4_;
        bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar121._16_4_ = bVar82 * uVar144 | !bVar82 * auVar121._16_4_;
        bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar121._20_4_ = bVar82 * uVar145 | !bVar82 * auVar121._20_4_;
        bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar121._24_4_ = bVar82 * uVar146 | !bVar82 * auVar121._24_4_;
        bVar82 = SUB81(uVar83 >> 7,0);
        auVar121._28_4_ = bVar82 * uVar147 | !bVar82 * auVar121._28_4_;
        auVar114 = vblendmps_avx512vl(auVar236,auVar114);
        bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar76 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
        bVar13 = (bool)((byte)(uVar76 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar76 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar76 >> 6) & 1);
        bVar16 = SUB81(uVar76 >> 7,0);
        auVar122._0_4_ =
             (uint)(bVar79 & 1) *
             ((uint)(bVar77 & 1) * auVar114._0_4_ | !(bool)(bVar77 & 1) * uVar84) |
             !(bool)(bVar79 & 1) * auVar122._0_4_;
        bVar10 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar122._4_4_ =
             (uint)bVar10 * ((uint)bVar82 * auVar114._4_4_ | !bVar82 * uVar141) |
             !bVar10 * auVar122._4_4_;
        bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar122._8_4_ =
             (uint)bVar82 * ((uint)bVar11 * auVar114._8_4_ | !bVar11 * uVar142) |
             !bVar82 * auVar122._8_4_;
        bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar122._12_4_ =
             (uint)bVar82 * ((uint)bVar12 * auVar114._12_4_ | !bVar12 * uVar143) |
             !bVar82 * auVar122._12_4_;
        bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar122._16_4_ =
             (uint)bVar82 * ((uint)bVar13 * auVar114._16_4_ | !bVar13 * uVar144) |
             !bVar82 * auVar122._16_4_;
        bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar122._20_4_ =
             (uint)bVar82 * ((uint)bVar14 * auVar114._20_4_ | !bVar14 * uVar145) |
             !bVar82 * auVar122._20_4_;
        bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar122._24_4_ =
             (uint)bVar82 * ((uint)bVar15 * auVar114._24_4_ | !bVar15 * uVar146) |
             !bVar82 * auVar122._24_4_;
        bVar82 = SUB81(uVar83 >> 7,0);
        auVar122._28_4_ =
             (uint)bVar82 * ((uint)bVar16 * auVar114._28_4_ | !bVar16 * uVar147) |
             !bVar82 * auVar122._28_4_;
        bVar74 = (~bVar79 | bVar77) & bVar74;
      }
      auVar112._8_4_ = 0x3f800000;
      auVar112._0_8_ = &DAT_3f8000003f800000;
      auVar112._12_4_ = 0x3f800000;
      auVar112._16_4_ = 0x3f800000;
      auVar112._20_4_ = 0x3f800000;
      auVar112._24_4_ = 0x3f800000;
      auVar112._28_4_ = 0x3f800000;
    }
    auVar225 = ZEXT3264(auVar112);
    if ((bVar74 & 0x7f) == 0) {
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar265 = ZEXT3264(auVar97);
      auVar211 = ZEXT1664(local_8a0);
    }
    else {
      fVar246 = *(float *)(ray + k * 4 + 0x80) - (float)local_750._0_4_;
      auVar222._4_4_ = fVar246;
      auVar222._0_4_ = fVar246;
      auVar222._8_4_ = fVar246;
      auVar222._12_4_ = fVar246;
      auVar222._16_4_ = fVar246;
      auVar222._20_4_ = fVar246;
      auVar222._24_4_ = fVar246;
      auVar222._28_4_ = fVar246;
      auVar114 = vminps_avx512vl(auVar222,auVar122);
      auVar73._4_4_ = fStack_21c;
      auVar73._0_4_ = local_220;
      auVar73._8_4_ = fStack_218;
      auVar73._12_4_ = fStack_214;
      auVar73._16_4_ = fStack_210;
      auVar73._20_4_ = fStack_20c;
      auVar73._24_4_ = fStack_208;
      auVar73._28_4_ = fStack_204;
      auVar118 = vmaxps_avx512vl(auVar73,auVar121);
      auVar111 = vmulps_avx512vl(auVar50,auVar111);
      auVar110 = vfmadd213ps_avx512vl(auVar110,auVar49,auVar111);
      auVar109 = vfmadd213ps_avx512vl(auVar109,auVar48,auVar110);
      auVar110 = vmulps_avx512vl(local_4e0,auVar50);
      auVar110 = vfmadd231ps_avx512vl(auVar110,local_4c0,auVar49);
      auVar110 = vfmadd231ps_avx512vl(auVar110,local_4a0,auVar48);
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar265 = ZEXT3264(auVar111);
      vandps_avx512vl(auVar110,auVar111);
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar17 = vcmpps_avx512vl(auVar111,auVar119,1);
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar109 = vxorps_avx512vl(auVar109,auVar120);
      auVar123 = vrcp14ps_avx512vl(auVar110);
      auVar124 = vxorps_avx512vl(auVar110,auVar120);
      auVar125 = vfnmadd213ps_avx512vl(auVar123,auVar110,auVar112);
      auVar125 = vfmadd132ps_avx512vl(auVar125,auVar123,auVar123);
      auVar125 = vmulps_avx512vl(auVar125,auVar109);
      uVar18 = vcmpps_avx512vl(auVar110,auVar124,1);
      bVar79 = (byte)uVar17 | (byte)uVar18;
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar109 = vblendmps_avx512vl(auVar125,auVar126);
      auVar127._0_4_ =
           (uint)(bVar79 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar123._0_4_;
      bVar82 = (bool)(bVar79 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar82 * auVar109._4_4_ | (uint)!bVar82 * auVar123._4_4_;
      bVar82 = (bool)(bVar79 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar82 * auVar109._8_4_ | (uint)!bVar82 * auVar123._8_4_;
      bVar82 = (bool)(bVar79 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar82 * auVar109._12_4_ | (uint)!bVar82 * auVar123._12_4_;
      bVar82 = (bool)(bVar79 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar82 * auVar109._16_4_ | (uint)!bVar82 * auVar123._16_4_;
      bVar82 = (bool)(bVar79 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar82 * auVar109._20_4_ | (uint)!bVar82 * auVar123._20_4_;
      bVar82 = (bool)(bVar79 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar82 * auVar109._24_4_ | (uint)!bVar82 * auVar123._24_4_;
      auVar127._28_4_ =
           (uint)(bVar79 >> 7) * auVar109._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar123._28_4_;
      auVar109 = vmaxps_avx(auVar118,auVar127);
      uVar18 = vcmpps_avx512vl(auVar110,auVar124,6);
      bVar79 = (byte)uVar17 | (byte)uVar18;
      auVar263 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar128._0_4_ = (uint)(bVar79 & 1) * 0x7f800000 | (uint)!(bool)(bVar79 & 1) * auVar125._0_4_;
      bVar82 = (bool)(bVar79 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * auVar125._4_4_;
      bVar82 = (bool)(bVar79 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * auVar125._8_4_;
      bVar82 = (bool)(bVar79 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * auVar125._12_4_;
      bVar82 = (bool)(bVar79 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * auVar125._16_4_;
      bVar82 = (bool)(bVar79 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * auVar125._20_4_;
      bVar82 = (bool)(bVar79 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * auVar125._24_4_;
      auVar128._28_4_ =
           (uint)(bVar79 >> 7) * 0x7f800000 | (uint)!(bool)(bVar79 >> 7) * auVar125._28_4_;
      auVar110 = vminps_avx(auVar114,auVar128);
      auVar85 = vxorps_avx512vl(auVar124._0_16_,auVar124._0_16_);
      auVar102 = vsubps_avx512vl(ZEXT1632(auVar85),auVar102);
      auVar105 = vsubps_avx512vl(ZEXT1632(auVar85),auVar105);
      auVar114 = ZEXT1632(auVar85);
      auVar106 = vsubps_avx512vl(auVar114,auVar106);
      auVar55._4_4_ = auVar106._4_4_ * auVar94._4_4_;
      auVar55._0_4_ = auVar106._0_4_ * auVar94._0_4_;
      auVar55._8_4_ = auVar106._8_4_ * auVar94._8_4_;
      auVar55._12_4_ = auVar106._12_4_ * auVar94._12_4_;
      auVar55._16_4_ = auVar106._16_4_ * auVar94._16_4_;
      auVar55._20_4_ = auVar106._20_4_ * auVar94._20_4_;
      auVar55._24_4_ = auVar106._24_4_ * auVar94._24_4_;
      auVar55._28_4_ = auVar106._28_4_;
      auVar105 = vfnmsub231ps_avx512vl(auVar55,auVar108,auVar105);
      auVar102 = vfnmadd231ps_avx512vl(auVar105,auVar107,auVar102);
      auVar105 = vmulps_avx512vl(local_4e0,auVar94);
      auVar105 = vfnmsub231ps_avx512vl(auVar105,local_4c0,auVar108);
      auVar105 = vfnmadd231ps_avx512vl(auVar105,local_4a0,auVar107);
      vandps_avx512vl(auVar105,auVar111);
      uVar17 = vcmpps_avx512vl(auVar105,auVar119,1);
      auVar102 = vxorps_avx512vl(auVar102,auVar120);
      auVar106 = vrcp14ps_avx512vl(auVar105);
      auVar107 = vxorps_avx512vl(auVar105,auVar120);
      auVar94 = vfnmadd213ps_avx512vl(auVar106,auVar105,auVar112);
      auVar85 = vfmadd132ps_fma(auVar94,auVar106,auVar106);
      auVar261 = ZEXT1664(auVar85);
      fVar246 = auVar85._0_4_ * auVar102._0_4_;
      fVar248 = auVar85._4_4_ * auVar102._4_4_;
      auVar56._4_4_ = fVar248;
      auVar56._0_4_ = fVar246;
      fVar249 = auVar85._8_4_ * auVar102._8_4_;
      auVar56._8_4_ = fVar249;
      fVar250 = auVar85._12_4_ * auVar102._12_4_;
      auVar56._12_4_ = fVar250;
      fVar251 = auVar102._16_4_ * 0.0;
      auVar56._16_4_ = fVar251;
      fVar252 = auVar102._20_4_ * 0.0;
      auVar56._20_4_ = fVar252;
      fVar253 = auVar102._24_4_ * 0.0;
      auVar56._24_4_ = fVar253;
      auVar56._28_4_ = auVar102._28_4_;
      uVar18 = vcmpps_avx512vl(auVar105,auVar107,1);
      bVar79 = (byte)uVar17 | (byte)uVar18;
      auVar94 = vblendmps_avx512vl(auVar56,auVar126);
      auVar129._0_4_ =
           (uint)(bVar79 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar106._0_4_;
      bVar82 = (bool)(bVar79 >> 1 & 1);
      auVar129._4_4_ = (uint)bVar82 * auVar94._4_4_ | (uint)!bVar82 * auVar106._4_4_;
      bVar82 = (bool)(bVar79 >> 2 & 1);
      auVar129._8_4_ = (uint)bVar82 * auVar94._8_4_ | (uint)!bVar82 * auVar106._8_4_;
      bVar82 = (bool)(bVar79 >> 3 & 1);
      auVar129._12_4_ = (uint)bVar82 * auVar94._12_4_ | (uint)!bVar82 * auVar106._12_4_;
      bVar82 = (bool)(bVar79 >> 4 & 1);
      auVar129._16_4_ = (uint)bVar82 * auVar94._16_4_ | (uint)!bVar82 * auVar106._16_4_;
      bVar82 = (bool)(bVar79 >> 5 & 1);
      auVar129._20_4_ = (uint)bVar82 * auVar94._20_4_ | (uint)!bVar82 * auVar106._20_4_;
      bVar82 = (bool)(bVar79 >> 6 & 1);
      auVar129._24_4_ = (uint)bVar82 * auVar94._24_4_ | (uint)!bVar82 * auVar106._24_4_;
      auVar129._28_4_ =
           (uint)(bVar79 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar106._28_4_;
      auVar255 = ZEXT3264(auVar129);
      _local_6e0 = vmaxps_avx(auVar109,auVar129);
      uVar18 = vcmpps_avx512vl(auVar105,auVar107,6);
      bVar79 = (byte)uVar17 | (byte)uVar18;
      auVar130._0_4_ = (uint)(bVar79 & 1) * 0x7f800000 | (uint)!(bool)(bVar79 & 1) * (int)fVar246;
      bVar82 = (bool)(bVar79 >> 1 & 1);
      auVar130._4_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar248;
      bVar82 = (bool)(bVar79 >> 2 & 1);
      auVar130._8_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar249;
      bVar82 = (bool)(bVar79 >> 3 & 1);
      auVar130._12_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar250;
      bVar82 = (bool)(bVar79 >> 4 & 1);
      auVar130._16_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar251;
      bVar82 = (bool)(bVar79 >> 5 & 1);
      auVar130._20_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar252;
      bVar82 = (bool)(bVar79 >> 6 & 1);
      auVar130._24_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar253;
      auVar130._28_4_ =
           (uint)(bVar79 >> 7) * 0x7f800000 | (uint)!(bool)(bVar79 >> 7) * auVar102._28_4_;
      auVar247 = ZEXT3264(auVar130);
      local_460 = vminps_avx(auVar110,auVar130);
      auVar245 = ZEXT3264(local_460);
      uVar17 = vcmpps_avx512vl(_local_6e0,local_460,2);
      bVar74 = bVar74 & 0x7f & (byte)uVar17;
      if (bVar74 == 0) {
        auVar225 = ZEXT3264(auVar112);
        auVar211 = ZEXT1664(local_8a0);
      }
      else {
        auVar102 = vmaxps_avx512vl(auVar114,auVar97);
        auVar97 = vminps_avx512vl(local_540,auVar112);
        auVar62 = ZEXT412(0);
        auVar255 = ZEXT1264(auVar62) << 0x20;
        auVar97 = vmaxps_avx(auVar97,ZEXT1232(auVar62) << 0x20);
        auVar105 = vminps_avx512vl(local_560,auVar112);
        auVar261 = ZEXT3264(CONCAT428(0x3e000000,
                                      CONCAT424(0x3e000000,
                                                CONCAT420(0x3e000000,
                                                          CONCAT416(0x3e000000,
                                                                    CONCAT412(0x3e000000,
                                                                              CONCAT48(0x3e000000,
                                                                                                                                                                              
                                                  0x3e0000003e000000)))))));
        auVar57._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
        auVar57._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
        auVar57._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
        auVar57._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
        auVar57._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
        auVar57._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
        auVar57._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
        auVar57._28_4_ = auVar97._28_4_ + 7.0;
        auVar263 = ZEXT3264(local_820);
        auVar85 = vfmadd213ps_fma(auVar57,local_820,auVar232);
        local_540 = ZEXT1632(auVar85);
        auVar97 = vmaxps_avx(auVar105,ZEXT1232(auVar62) << 0x20);
        auVar58._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
        auVar58._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
        auVar58._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
        auVar58._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
        auVar58._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
        auVar58._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
        auVar58._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
        auVar58._28_4_ = auVar97._28_4_ + 7.0;
        auVar85 = vfmadd213ps_fma(auVar58,local_820,auVar232);
        local_560 = ZEXT1632(auVar85);
        auVar223._0_4_ = auVar102._0_4_ * auVar102._0_4_;
        auVar223._4_4_ = auVar102._4_4_ * auVar102._4_4_;
        auVar223._8_4_ = auVar102._8_4_ * auVar102._8_4_;
        auVar223._12_4_ = auVar102._12_4_ * auVar102._12_4_;
        auVar223._16_4_ = auVar102._16_4_ * auVar102._16_4_;
        auVar223._20_4_ = auVar102._20_4_ * auVar102._20_4_;
        auVar223._24_4_ = auVar102._24_4_ * auVar102._24_4_;
        auVar223._28_4_ = 0;
        auVar97 = vsubps_avx(local_8c0,auVar223);
        auVar102 = vmulps_avx512vl(auVar117,auVar97);
        auVar102 = vsubps_avx512vl(auVar116,auVar102);
        uVar17 = vcmpps_avx512vl(auVar102,ZEXT1232(auVar62) << 0x20,5);
        bVar79 = (byte)uVar17;
        if (bVar79 == 0) {
          auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar99 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar102 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar105 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar247 = ZEXT864(0) << 0x20;
          auVar131._8_4_ = 0x7f800000;
          auVar131._0_8_ = 0x7f8000007f800000;
          auVar131._12_4_ = 0x7f800000;
          auVar131._16_4_ = 0x7f800000;
          auVar131._20_4_ = 0x7f800000;
          auVar131._24_4_ = 0x7f800000;
          auVar131._28_4_ = 0x7f800000;
          auVar132._8_4_ = 0xff800000;
          auVar132._0_8_ = 0xff800000ff800000;
          auVar132._12_4_ = 0xff800000;
          auVar132._16_4_ = 0xff800000;
          auVar132._20_4_ = 0xff800000;
          auVar132._24_4_ = 0xff800000;
          auVar132._28_4_ = 0xff800000;
        }
        else {
          auVar87 = vxorps_avx512vl(auVar108._0_16_,auVar108._0_16_);
          uVar83 = vcmpps_avx512vl(auVar102,auVar114,5);
          auVar102 = vsqrtps_avx(auVar102);
          auVar235._0_4_ = auVar95._0_4_ + auVar95._0_4_;
          auVar235._4_4_ = auVar95._4_4_ + auVar95._4_4_;
          auVar235._8_4_ = auVar95._8_4_ + auVar95._8_4_;
          auVar235._12_4_ = auVar95._12_4_ + auVar95._12_4_;
          auVar235._16_4_ = auVar95._16_4_ + auVar95._16_4_;
          auVar235._20_4_ = auVar95._20_4_ + auVar95._20_4_;
          auVar235._24_4_ = auVar95._24_4_ + auVar95._24_4_;
          auVar235._28_4_ = auVar95._28_4_ + auVar95._28_4_;
          auVar105 = vrcp14ps_avx512vl(auVar235);
          auVar106 = vfnmadd213ps_avx512vl(auVar235,auVar105,auVar112);
          auVar85 = vfmadd132ps_fma(auVar106,auVar105,auVar105);
          auVar28._8_4_ = 0x80000000;
          auVar28._0_8_ = 0x8000000080000000;
          auVar28._12_4_ = 0x80000000;
          auVar28._16_4_ = 0x80000000;
          auVar28._20_4_ = 0x80000000;
          auVar28._24_4_ = 0x80000000;
          auVar28._28_4_ = 0x80000000;
          auVar105 = vxorps_avx512vl(auVar113,auVar28);
          auVar105 = vsubps_avx(auVar105,auVar102);
          auVar59._4_4_ = auVar105._4_4_ * auVar85._4_4_;
          auVar59._0_4_ = auVar105._0_4_ * auVar85._0_4_;
          auVar59._8_4_ = auVar105._8_4_ * auVar85._8_4_;
          auVar59._12_4_ = auVar105._12_4_ * auVar85._12_4_;
          auVar59._16_4_ = auVar105._16_4_ * 0.0;
          auVar59._20_4_ = auVar105._20_4_ * 0.0;
          auVar59._24_4_ = auVar105._24_4_ * 0.0;
          auVar59._28_4_ = 0x3e000000;
          auVar261 = ZEXT3264(auVar59);
          auVar102 = vsubps_avx512vl(auVar102,auVar113);
          auVar60._4_4_ = auVar102._4_4_ * auVar85._4_4_;
          auVar60._0_4_ = auVar102._0_4_ * auVar85._0_4_;
          auVar60._8_4_ = auVar102._8_4_ * auVar85._8_4_;
          auVar60._12_4_ = auVar102._12_4_ * auVar85._12_4_;
          auVar60._16_4_ = auVar102._16_4_ * 0.0;
          auVar60._20_4_ = auVar102._20_4_ * 0.0;
          auVar60._24_4_ = auVar102._24_4_ * 0.0;
          auVar60._28_4_ = fVar195;
          auVar263 = ZEXT3264(auVar60);
          auVar102 = vfmadd213ps_avx512vl(auVar115,auVar59,auVar98);
          auVar61._4_4_ = auVar96._4_4_ * auVar102._4_4_;
          auVar61._0_4_ = auVar96._0_4_ * auVar102._0_4_;
          auVar61._8_4_ = auVar96._8_4_ * auVar102._8_4_;
          auVar61._12_4_ = auVar96._12_4_ * auVar102._12_4_;
          auVar61._16_4_ = auVar96._16_4_ * auVar102._16_4_;
          auVar61._20_4_ = auVar96._20_4_ * auVar102._20_4_;
          auVar61._24_4_ = auVar96._24_4_ * auVar102._24_4_;
          auVar61._28_4_ = auVar105._28_4_;
          auVar102 = vmulps_avx512vl(local_4a0,auVar59);
          auVar105 = vmulps_avx512vl(local_4c0,auVar59);
          auVar106 = vmulps_avx512vl(local_4e0,auVar59);
          auVar107 = vfmadd213ps_avx512vl(auVar99,auVar61,auVar103);
          auVar102 = vsubps_avx512vl(auVar102,auVar107);
          auVar107 = vfmadd213ps_avx512vl(auVar100,auVar61,auVar104);
          auVar105 = vsubps_avx512vl(auVar105,auVar107);
          auVar85 = vfmadd213ps_fma(auVar61,auVar101,local_840);
          auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar85));
          auVar247 = ZEXT3264(auVar106);
          auVar98 = vfmadd213ps_avx512vl(auVar115,auVar60,auVar98);
          auVar106 = vmulps_avx512vl(auVar96,auVar98);
          auVar98 = vmulps_avx512vl(local_4a0,auVar60);
          auVar96 = vmulps_avx512vl(local_4c0,auVar60);
          auVar107 = vmulps_avx512vl(local_4e0,auVar60);
          auVar85 = vfmadd213ps_fma(auVar99,auVar106,auVar103);
          auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar85));
          auVar255 = ZEXT3264(auVar98);
          auVar85 = vfmadd213ps_fma(auVar100,auVar106,auVar104);
          auVar98 = vsubps_avx512vl(auVar96,ZEXT1632(auVar85));
          auVar85 = vfmadd213ps_fma(auVar101,auVar106,local_840);
          auVar99 = vsubps_avx512vl(auVar107,ZEXT1632(auVar85));
          auVar159._8_4_ = 0x7f800000;
          auVar159._0_8_ = 0x7f8000007f800000;
          auVar159._12_4_ = 0x7f800000;
          auVar159._16_4_ = 0x7f800000;
          auVar159._20_4_ = 0x7f800000;
          auVar159._24_4_ = 0x7f800000;
          auVar159._28_4_ = 0x7f800000;
          auVar100 = vblendmps_avx512vl(auVar159,auVar59);
          bVar82 = (bool)((byte)uVar83 & 1);
          auVar131._0_4_ = (uint)bVar82 * auVar100._0_4_ | (uint)!bVar82 * auVar103._0_4_;
          bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar131._4_4_ = (uint)bVar82 * auVar100._4_4_ | (uint)!bVar82 * auVar103._4_4_;
          bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar131._8_4_ = (uint)bVar82 * auVar100._8_4_ | (uint)!bVar82 * auVar103._8_4_;
          bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar131._12_4_ = (uint)bVar82 * auVar100._12_4_ | (uint)!bVar82 * auVar103._12_4_;
          bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar131._16_4_ = (uint)bVar82 * auVar100._16_4_ | (uint)!bVar82 * auVar103._16_4_;
          bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar131._20_4_ = (uint)bVar82 * auVar100._20_4_ | (uint)!bVar82 * auVar103._20_4_;
          bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar131._24_4_ = (uint)bVar82 * auVar100._24_4_ | (uint)!bVar82 * auVar103._24_4_;
          bVar82 = SUB81(uVar83 >> 7,0);
          auVar131._28_4_ = (uint)bVar82 * auVar100._28_4_ | (uint)!bVar82 * auVar103._28_4_;
          auVar160._8_4_ = 0xff800000;
          auVar160._0_8_ = 0xff800000ff800000;
          auVar160._12_4_ = 0xff800000;
          auVar160._16_4_ = 0xff800000;
          auVar160._20_4_ = 0xff800000;
          auVar160._24_4_ = 0xff800000;
          auVar160._28_4_ = 0xff800000;
          auVar100 = vblendmps_avx512vl(auVar160,auVar60);
          bVar82 = (bool)((byte)uVar83 & 1);
          auVar132._0_4_ = (uint)bVar82 * auVar100._0_4_ | (uint)!bVar82 * -0x800000;
          bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar132._4_4_ = (uint)bVar82 * auVar100._4_4_ | (uint)!bVar82 * -0x800000;
          bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar132._8_4_ = (uint)bVar82 * auVar100._8_4_ | (uint)!bVar82 * -0x800000;
          bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar132._12_4_ = (uint)bVar82 * auVar100._12_4_ | (uint)!bVar82 * -0x800000;
          bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar132._16_4_ = (uint)bVar82 * auVar100._16_4_ | (uint)!bVar82 * -0x800000;
          bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar132._20_4_ = (uint)bVar82 * auVar100._20_4_ | (uint)!bVar82 * -0x800000;
          bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar132._24_4_ = (uint)bVar82 * auVar100._24_4_ | (uint)!bVar82 * -0x800000;
          bVar82 = SUB81(uVar83 >> 7,0);
          auVar132._28_4_ = (uint)bVar82 * auVar100._28_4_ | (uint)!bVar82 * -0x800000;
          vandps_avx512vl(auVar111,local_6c0);
          auVar100 = vmaxps_avx(local_500,auVar132);
          auVar29._8_4_ = 0x36000000;
          auVar29._0_8_ = 0x3600000036000000;
          auVar29._12_4_ = 0x36000000;
          auVar29._16_4_ = 0x36000000;
          auVar29._20_4_ = 0x36000000;
          auVar29._24_4_ = 0x36000000;
          auVar29._28_4_ = 0x36000000;
          auVar100 = vmulps_avx512vl(auVar100,auVar29);
          vandps_avx512vl(auVar95,auVar111);
          uVar76 = vcmpps_avx512vl(auVar100,auVar100,1);
          uVar83 = uVar83 & uVar76;
          bVar77 = (byte)uVar83;
          if (bVar77 != 0) {
            uVar76 = vcmpps_avx512vl(auVar97,ZEXT1632(auVar87),2);
            auVar244._8_4_ = 0xff800000;
            auVar244._0_8_ = 0xff800000ff800000;
            auVar244._12_4_ = 0xff800000;
            auVar244._16_4_ = 0xff800000;
            auVar244._20_4_ = 0xff800000;
            auVar244._24_4_ = 0xff800000;
            auVar244._28_4_ = 0xff800000;
            auVar256._8_4_ = 0x7f800000;
            auVar256._0_8_ = 0x7f8000007f800000;
            auVar256._12_4_ = 0x7f800000;
            auVar256._16_4_ = 0x7f800000;
            auVar256._20_4_ = 0x7f800000;
            auVar256._24_4_ = 0x7f800000;
            auVar256._28_4_ = 0x7f800000;
            auVar97 = vblendmps_avx512vl(auVar256,auVar244);
            bVar75 = (byte)uVar76;
            uVar84 = (uint)(bVar75 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar100._0_4_
            ;
            bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
            uVar141 = (uint)bVar82 * auVar97._4_4_ | (uint)!bVar82 * auVar100._4_4_;
            bVar82 = (bool)((byte)(uVar76 >> 2) & 1);
            uVar142 = (uint)bVar82 * auVar97._8_4_ | (uint)!bVar82 * auVar100._8_4_;
            bVar82 = (bool)((byte)(uVar76 >> 3) & 1);
            uVar143 = (uint)bVar82 * auVar97._12_4_ | (uint)!bVar82 * auVar100._12_4_;
            bVar82 = (bool)((byte)(uVar76 >> 4) & 1);
            uVar144 = (uint)bVar82 * auVar97._16_4_ | (uint)!bVar82 * auVar100._16_4_;
            bVar82 = (bool)((byte)(uVar76 >> 5) & 1);
            uVar145 = (uint)bVar82 * auVar97._20_4_ | (uint)!bVar82 * auVar100._20_4_;
            bVar82 = (bool)((byte)(uVar76 >> 6) & 1);
            uVar146 = (uint)bVar82 * auVar97._24_4_ | (uint)!bVar82 * auVar100._24_4_;
            bVar82 = SUB81(uVar76 >> 7,0);
            uVar147 = (uint)bVar82 * auVar97._28_4_ | (uint)!bVar82 * auVar100._28_4_;
            auVar131._0_4_ = (bVar77 & 1) * uVar84 | !(bool)(bVar77 & 1) * auVar131._0_4_;
            bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar131._4_4_ = bVar82 * uVar141 | !bVar82 * auVar131._4_4_;
            bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar131._8_4_ = bVar82 * uVar142 | !bVar82 * auVar131._8_4_;
            bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar131._12_4_ = bVar82 * uVar143 | !bVar82 * auVar131._12_4_;
            bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar131._16_4_ = bVar82 * uVar144 | !bVar82 * auVar131._16_4_;
            bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar131._20_4_ = bVar82 * uVar145 | !bVar82 * auVar131._20_4_;
            bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar131._24_4_ = bVar82 * uVar146 | !bVar82 * auVar131._24_4_;
            bVar82 = SUB81(uVar83 >> 7,0);
            auVar131._28_4_ = bVar82 * uVar147 | !bVar82 * auVar131._28_4_;
            auVar97 = vblendmps_avx512vl(auVar244,auVar256);
            bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar11 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar76 >> 4) & 1);
            bVar14 = (bool)((byte)(uVar76 >> 5) & 1);
            bVar15 = (bool)((byte)(uVar76 >> 6) & 1);
            bVar16 = SUB81(uVar76 >> 7,0);
            auVar132._0_4_ =
                 (uint)(bVar77 & 1) *
                 ((uint)(bVar75 & 1) * auVar97._0_4_ | !(bool)(bVar75 & 1) * uVar84) |
                 !(bool)(bVar77 & 1) * auVar132._0_4_;
            bVar10 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar132._4_4_ =
                 (uint)bVar10 * ((uint)bVar82 * auVar97._4_4_ | !bVar82 * uVar141) |
                 !bVar10 * auVar132._4_4_;
            bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar132._8_4_ =
                 (uint)bVar82 * ((uint)bVar11 * auVar97._8_4_ | !bVar11 * uVar142) |
                 !bVar82 * auVar132._8_4_;
            bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar132._12_4_ =
                 (uint)bVar82 * ((uint)bVar12 * auVar97._12_4_ | !bVar12 * uVar143) |
                 !bVar82 * auVar132._12_4_;
            bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar132._16_4_ =
                 (uint)bVar82 * ((uint)bVar13 * auVar97._16_4_ | !bVar13 * uVar144) |
                 !bVar82 * auVar132._16_4_;
            bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar132._20_4_ =
                 (uint)bVar82 * ((uint)bVar14 * auVar97._20_4_ | !bVar14 * uVar145) |
                 !bVar82 * auVar132._20_4_;
            bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar132._24_4_ =
                 (uint)bVar82 * ((uint)bVar15 * auVar97._24_4_ | !bVar15 * uVar146) |
                 !bVar82 * auVar132._24_4_;
            bVar82 = SUB81(uVar83 >> 7,0);
            auVar132._28_4_ =
                 (uint)bVar82 * ((uint)bVar16 * auVar97._28_4_ | !bVar16 * uVar147) |
                 !bVar82 * auVar132._28_4_;
            bVar79 = (~bVar77 | bVar75) & bVar79;
          }
        }
        auVar97 = vmulps_avx512vl(local_4e0,auVar99);
        auVar97 = vfmadd231ps_avx512vl(auVar97,local_4c0,auVar98);
        auVar97 = vfmadd231ps_avx512vl(auVar97,local_4a0,auVar255._0_32_);
        _local_1c0 = _local_6e0;
        local_1a0 = vminps_avx(local_460,auVar131);
        vandps_avx512vl(auVar97,auVar111);
        _local_480 = vmaxps_avx(_local_6e0,auVar132);
        auVar240 = ZEXT3264(_local_480);
        auVar161._8_4_ = 0x3e99999a;
        auVar161._0_8_ = 0x3e99999a3e99999a;
        auVar161._12_4_ = 0x3e99999a;
        auVar161._16_4_ = 0x3e99999a;
        auVar161._20_4_ = 0x3e99999a;
        auVar161._24_4_ = 0x3e99999a;
        auVar161._28_4_ = 0x3e99999a;
        uVar17 = vcmpps_avx512vl(auVar97,auVar161,1);
        local_8cc = (undefined4)uVar17;
        uVar17 = vcmpps_avx512vl(_local_6e0,local_1a0,2);
        bVar77 = (byte)uVar17 & bVar74;
        _local_5a0 = _local_480;
        uVar18 = vcmpps_avx512vl(_local_480,local_460,2);
        if ((bVar74 & ((byte)uVar18 | (byte)uVar17)) == 0) {
          auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          auVar211 = ZEXT1664(local_8a0);
        }
        else {
          auVar97 = vmulps_avx512vl(local_4e0,auVar247._0_32_);
          auVar97 = vfmadd213ps_avx512vl(auVar105,local_4c0,auVar97);
          auVar97 = vfmadd213ps_avx512vl(auVar102,local_4a0,auVar97);
          vandps_avx512vl(auVar97,auVar111);
          uVar17 = vcmpps_avx512vl(auVar97,auVar161,1);
          local_8d4 = (uint)(byte)~bVar79;
          bVar79 = (byte)uVar17 | ~bVar79;
          auVar162._8_4_ = 2;
          auVar162._0_8_ = 0x200000002;
          auVar162._12_4_ = 2;
          auVar162._16_4_ = 2;
          auVar162._20_4_ = 2;
          auVar162._24_4_ = 2;
          auVar162._28_4_ = 2;
          auVar30._8_4_ = 3;
          auVar30._0_8_ = 0x300000003;
          auVar30._12_4_ = 3;
          auVar30._16_4_ = 3;
          auVar30._20_4_ = 3;
          auVar30._24_4_ = 3;
          auVar30._28_4_ = 3;
          auVar97 = vpblendmd_avx512vl(auVar162,auVar30);
          local_440._0_4_ = (uint)(bVar79 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar79 & 1) * 2;
          bVar82 = (bool)(bVar79 >> 1 & 1);
          local_440._4_4_ = (uint)bVar82 * auVar97._4_4_ | (uint)!bVar82 * 2;
          bVar82 = (bool)(bVar79 >> 2 & 1);
          local_440._8_4_ = (uint)bVar82 * auVar97._8_4_ | (uint)!bVar82 * 2;
          bVar82 = (bool)(bVar79 >> 3 & 1);
          local_440._12_4_ = (uint)bVar82 * auVar97._12_4_ | (uint)!bVar82 * 2;
          bVar82 = (bool)(bVar79 >> 4 & 1);
          local_440._16_4_ = (uint)bVar82 * auVar97._16_4_ | (uint)!bVar82 * 2;
          bVar82 = (bool)(bVar79 >> 5 & 1);
          local_440._20_4_ = (uint)bVar82 * auVar97._20_4_ | (uint)!bVar82 * 2;
          bVar82 = (bool)(bVar79 >> 6 & 1);
          local_440._24_4_ = (uint)bVar82 * auVar97._24_4_ | (uint)!bVar82 * 2;
          local_440._28_4_ = (uint)(bVar79 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar79 >> 7) * 2;
          local_520 = vpbroadcastd_avx512vl();
          uVar17 = vpcmpd_avx512vl(local_520,local_440,5);
          local_8d0 = (uint)bVar77;
          bVar77 = (byte)uVar17 & bVar77;
          if (bVar77 == 0) {
            auVar229._8_4_ = 0x7fffffff;
            auVar229._0_8_ = 0x7fffffff7fffffff;
            auVar229._12_4_ = 0x7fffffff;
          }
          else {
            auVar87 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar85 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar88 = vminps_avx(local_7a0._0_16_,local_7e0._0_16_);
            auVar2 = vminps_avx(auVar87,auVar88);
            auVar87 = vmaxps_avx(local_7a0._0_16_,local_7e0._0_16_);
            auVar88 = vmaxps_avx(auVar85,auVar87);
            auVar197._8_4_ = 0x7fffffff;
            auVar197._0_8_ = 0x7fffffff7fffffff;
            auVar197._12_4_ = 0x7fffffff;
            auVar85 = vandps_avx(auVar2,auVar197);
            auVar87 = vandps_avx(auVar88,auVar197);
            auVar85 = vmaxps_avx(auVar85,auVar87);
            auVar87 = vmovshdup_avx(auVar85);
            auVar87 = vmaxss_avx(auVar87,auVar85);
            auVar85 = vshufpd_avx(auVar85,auVar85,1);
            auVar85 = vmaxss_avx(auVar85,auVar87);
            fVar246 = auVar85._0_4_ * 1.9073486e-06;
            local_760 = vshufps_avx(auVar88,auVar88,0xff);
            local_580 = (float)local_6e0._0_4_ + (float)local_5c0._0_4_;
            fStack_57c = (float)local_6e0._4_4_ + (float)local_5c0._4_4_;
            fStack_578 = fStack_6d8 + fStack_5b8;
            fStack_574 = fStack_6d4 + fStack_5b4;
            fStack_570 = fStack_6d0 + fStack_5b0;
            fStack_56c = fStack_6cc + fStack_5ac;
            fStack_568 = fStack_6c8 + fStack_5a8;
            fStack_564 = fStack_6c4 + fStack_5a4;
            do {
              auVar163._8_4_ = 0x7f800000;
              auVar163._0_8_ = 0x7f8000007f800000;
              auVar163._12_4_ = 0x7f800000;
              auVar163._16_4_ = 0x7f800000;
              auVar163._20_4_ = 0x7f800000;
              auVar163._24_4_ = 0x7f800000;
              auVar163._28_4_ = 0x7f800000;
              auVar97 = vblendmps_avx512vl(auVar163,_local_6e0);
              auVar133._0_4_ =
                   (uint)(bVar77 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar77 & 1) * 0x7f800000;
              bVar82 = (bool)(bVar77 >> 1 & 1);
              auVar133._4_4_ = (uint)bVar82 * auVar97._4_4_ | (uint)!bVar82 * 0x7f800000;
              bVar82 = (bool)(bVar77 >> 2 & 1);
              auVar133._8_4_ = (uint)bVar82 * auVar97._8_4_ | (uint)!bVar82 * 0x7f800000;
              bVar82 = (bool)(bVar77 >> 3 & 1);
              auVar133._12_4_ = (uint)bVar82 * auVar97._12_4_ | (uint)!bVar82 * 0x7f800000;
              bVar82 = (bool)(bVar77 >> 4 & 1);
              auVar133._16_4_ = (uint)bVar82 * auVar97._16_4_ | (uint)!bVar82 * 0x7f800000;
              bVar82 = (bool)(bVar77 >> 5 & 1);
              auVar133._20_4_ = (uint)bVar82 * auVar97._20_4_ | (uint)!bVar82 * 0x7f800000;
              auVar133._24_4_ =
                   (uint)(bVar77 >> 6) * auVar97._24_4_ | (uint)!(bool)(bVar77 >> 6) * 0x7f800000;
              auVar133._28_4_ = 0x7f800000;
              auVar97 = vshufps_avx(auVar133,auVar133,0xb1);
              auVar97 = vminps_avx(auVar133,auVar97);
              auVar98 = vshufpd_avx(auVar97,auVar97,5);
              auVar97 = vminps_avx(auVar97,auVar98);
              auVar98 = vpermpd_avx2(auVar97,0x4e);
              auVar97 = vminps_avx(auVar97,auVar98);
              uVar17 = vcmpps_avx512vl(auVar133,auVar97,0);
              bVar75 = (byte)uVar17 & bVar77;
              bVar79 = bVar77;
              if (bVar75 != 0) {
                bVar79 = bVar75;
              }
              iVar20 = 0;
              for (uVar84 = (uint)bVar79; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
                iVar20 = iVar20 + 1;
              }
              bVar79 = '\x01' << ((byte)iVar20 & 0x1f);
              uVar84 = *(uint *)(local_540 + (uint)(iVar20 << 2));
              uVar141 = *(uint *)(local_1c0 + (uint)(iVar20 << 2));
              fVar248 = local_8c8;
              if ((float)local_800._0_4_ < 0.0) {
                fVar248 = sqrtf((float)local_800._0_4_);
              }
              auVar255 = ZEXT464(uVar84);
              auVar245 = ZEXT464(uVar141);
              bVar75 = ~bVar79;
              lVar81 = 5;
              do {
                fVar249 = auVar245._0_4_;
                auVar151._4_4_ = fVar249;
                auVar151._0_4_ = fVar249;
                auVar151._8_4_ = fVar249;
                auVar151._12_4_ = fVar249;
                auVar85 = vfmadd132ps_fma(auVar151,ZEXT816(0) << 0x40,local_7f0);
                fVar254 = auVar255._0_4_;
                fVar237 = 1.0 - fVar254;
                fVar252 = fVar237 * fVar237 * fVar237;
                fVar250 = fVar254 * fVar254;
                fVar215 = fVar254 * fVar250;
                auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar252),
                                          ZEXT416((uint)fVar215));
                fVar251 = fVar254 * fVar237;
                auVar227 = ZEXT416((uint)fVar237);
                auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar254 * fVar251 * 6.0)),
                                         ZEXT416((uint)(fVar251 * fVar237)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar215),
                                          ZEXT416((uint)fVar252));
                auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar237 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar254 * fVar251)));
                fVar252 = fVar252 * 0.16666667;
                fVar253 = (auVar87._0_4_ + auVar2._0_4_) * 0.16666667;
                fVar173 = (auVar88._0_4_ + auVar3._0_4_) * 0.16666667;
                fVar215 = fVar215 * 0.16666667;
                auVar198._0_4_ = fVar215 * (float)local_7e0._0_4_;
                auVar198._4_4_ = fVar215 * (float)local_7e0._4_4_;
                auVar198._8_4_ = fVar215 * fStack_7d8;
                auVar198._12_4_ = fVar215 * fStack_7d4;
                auVar228._4_4_ = fVar173;
                auVar228._0_4_ = fVar173;
                auVar228._8_4_ = fVar173;
                auVar228._12_4_ = fVar173;
                auVar87 = vfmadd132ps_fma(auVar228,auVar198,local_7a0._0_16_);
                auVar199._4_4_ = fVar253;
                auVar199._0_4_ = fVar253;
                auVar199._8_4_ = fVar253;
                auVar199._12_4_ = fVar253;
                auVar87 = vfmadd132ps_fma(auVar199,auVar87,local_7c0._0_16_);
                auVar176._4_4_ = fVar252;
                auVar176._0_4_ = fVar252;
                auVar176._8_4_ = fVar252;
                auVar176._12_4_ = fVar252;
                auVar87 = vfmadd132ps_fma(auVar176,auVar87,local_780._0_16_);
                local_6c0._0_16_ = auVar87;
                auVar85 = vsubps_avx(auVar85,auVar87);
                local_820._0_16_ = auVar85;
                auVar85 = vdpps_avx(auVar85,auVar85,0x7f);
                auVar87 = auVar255._0_16_;
                local_840._0_16_ = auVar85;
                if (auVar85._0_4_ < 0.0) {
                  local_8c0._0_4_ = fVar250;
                  auVar225._0_4_ = sqrtf(auVar85._0_4_);
                  auVar225._4_60_ = extraout_var;
                  auVar85 = auVar225._0_16_;
                }
                else {
                  auVar85 = vsqrtss_avx(auVar85,auVar85);
                  local_8c0._0_4_ = fVar250;
                }
                auVar2 = vfnmsub213ss_fma(auVar87,auVar87,ZEXT416((uint)(fVar251 * 4.0)));
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * 4.0)),auVar227,auVar227);
                fVar250 = fVar237 * -fVar237 * 0.5;
                fVar251 = auVar2._0_4_ * 0.5;
                fVar252 = auVar88._0_4_ * 0.5;
                local_8c0._0_4_ = (float)local_8c0._0_4_ * 0.5;
                auVar217._0_4_ = (float)local_8c0._0_4_ * (float)local_7e0._0_4_;
                auVar217._4_4_ = (float)local_8c0._0_4_ * (float)local_7e0._4_4_;
                auVar217._8_4_ = (float)local_8c0._0_4_ * fStack_7d8;
                auVar217._12_4_ = (float)local_8c0._0_4_ * fStack_7d4;
                auVar177._4_4_ = fVar252;
                auVar177._0_4_ = fVar252;
                auVar177._8_4_ = fVar252;
                auVar177._12_4_ = fVar252;
                auVar88 = vfmadd132ps_fma(auVar177,auVar217,local_7a0._0_16_);
                auVar200._4_4_ = fVar251;
                auVar200._0_4_ = fVar251;
                auVar200._8_4_ = fVar251;
                auVar200._12_4_ = fVar251;
                auVar88 = vfmadd132ps_fma(auVar200,auVar88,local_7c0._0_16_);
                auVar259._4_4_ = fVar250;
                auVar259._0_4_ = fVar250;
                auVar259._8_4_ = fVar250;
                auVar259._12_4_ = fVar250;
                local_8c0._0_16_ = vfmadd132ps_fma(auVar259,auVar88,local_780._0_16_);
                local_710 = vdpps_avx(local_8c0._0_16_,local_8c0._0_16_,0x7f);
                auVar63._12_4_ = 0;
                auVar63._0_12_ = ZEXT812(0);
                fVar250 = local_710._0_4_;
                auVar88 = vrsqrt14ss_avx512f(auVar63 << 0x20,ZEXT416((uint)fVar250));
                fVar251 = auVar88._0_4_;
                local_720 = vrcp14ss_avx512f(auVar63 << 0x20,ZEXT416((uint)fVar250));
                auVar88 = vfnmadd213ss_fma(local_720,local_710,ZEXT416(0x40000000));
                uVar84 = auVar85._0_4_;
                local_700 = fVar237;
                fStack_6fc = fVar237;
                fStack_6f8 = fVar237;
                fStack_6f4 = fVar237;
                if (fVar250 < -fVar250) {
                  fVar252 = sqrtf(fVar250);
                  auVar85 = ZEXT416(uVar84);
                  auVar2 = local_8c0._0_16_;
                }
                else {
                  auVar2 = vsqrtss_avx(local_710,local_710);
                  fVar252 = auVar2._0_4_;
                  auVar2 = local_8c0._0_16_;
                }
                fVar250 = fVar251 * 1.5 + fVar250 * -0.5 * fVar251 * fVar251 * fVar251;
                auVar152._0_4_ = auVar2._0_4_ * fVar250;
                auVar152._4_4_ = auVar2._4_4_ * fVar250;
                auVar152._8_4_ = auVar2._8_4_ * fVar250;
                auVar152._12_4_ = auVar2._12_4_ * fVar250;
                auVar3 = vdpps_avx(local_820._0_16_,auVar152,0x7f);
                fVar173 = auVar85._0_4_;
                fVar251 = auVar3._0_4_;
                auVar153._0_4_ = fVar251 * fVar251;
                auVar153._4_4_ = auVar3._4_4_ * auVar3._4_4_;
                auVar153._8_4_ = auVar3._8_4_ * auVar3._8_4_;
                auVar153._12_4_ = auVar3._12_4_ * auVar3._12_4_;
                auVar86 = vsubps_avx512vl(local_840._0_16_,auVar153);
                fVar253 = auVar86._0_4_;
                auVar178._4_12_ = ZEXT812(0) << 0x20;
                auVar178._0_4_ = fVar253;
                auVar89 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
                auVar90 = vmulss_avx512f(auVar89,ZEXT416(0x3fc00000));
                auVar91 = vmulss_avx512f(auVar86,ZEXT416(0xbf000000));
                if (fVar253 < 0.0) {
                  local_740 = fVar250;
                  fStack_73c = fVar250;
                  fStack_738 = fVar250;
                  fStack_734 = fVar250;
                  local_730 = auVar89;
                  fVar253 = sqrtf(fVar253);
                  auVar91 = ZEXT416(auVar91._0_4_);
                  auVar90 = ZEXT416(auVar90._0_4_);
                  auVar85 = ZEXT416(uVar84);
                  auVar2 = local_8c0._0_16_;
                  auVar89 = local_730;
                  fVar250 = local_740;
                  fVar215 = fStack_73c;
                  fVar237 = fStack_738;
                  fVar238 = fStack_734;
                }
                else {
                  auVar86 = vsqrtss_avx(auVar86,auVar86);
                  fVar253 = auVar86._0_4_;
                  fVar215 = fVar250;
                  fVar237 = fVar250;
                  fVar238 = fVar250;
                }
                auVar261 = ZEXT1664(auVar2);
                auVar247 = ZEXT1664(local_820._0_16_);
                auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar265 = ZEXT3264(auVar97);
                auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar227,auVar87);
                auVar87 = vfmadd231ss_fma(auVar227,auVar87,SUB6416(ZEXT464(0xc0000000),0));
                auVar201._0_4_ = fVar254 * (float)local_7e0._0_4_;
                auVar201._4_4_ = fVar254 * (float)local_7e0._4_4_;
                auVar201._8_4_ = fVar254 * fStack_7d8;
                auVar201._12_4_ = fVar254 * fStack_7d4;
                auVar218._0_4_ = auVar87._0_4_;
                auVar218._4_4_ = auVar218._0_4_;
                auVar218._8_4_ = auVar218._0_4_;
                auVar218._12_4_ = auVar218._0_4_;
                auVar87 = vfmadd132ps_fma(auVar218,auVar201,local_7a0._0_16_);
                auVar179._0_4_ = auVar86._0_4_;
                auVar179._4_4_ = auVar179._0_4_;
                auVar179._8_4_ = auVar179._0_4_;
                auVar179._12_4_ = auVar179._0_4_;
                auVar87 = vfmadd132ps_fma(auVar179,auVar87,local_7c0._0_16_);
                auVar69._4_4_ = fStack_6fc;
                auVar69._0_4_ = local_700;
                auVar69._8_4_ = fStack_6f8;
                auVar69._12_4_ = fStack_6f4;
                auVar87 = vfmadd132ps_fma(auVar69,auVar87,local_780._0_16_);
                auVar180._0_4_ = auVar87._0_4_ * (float)local_710._0_4_;
                auVar180._4_4_ = auVar87._4_4_ * (float)local_710._0_4_;
                auVar180._8_4_ = auVar87._8_4_ * (float)local_710._0_4_;
                auVar180._12_4_ = auVar87._12_4_ * (float)local_710._0_4_;
                auVar87 = vdpps_avx(auVar2,auVar87,0x7f);
                fVar195 = auVar87._0_4_;
                auVar202._0_4_ = auVar2._0_4_ * fVar195;
                auVar202._4_4_ = auVar2._4_4_ * fVar195;
                auVar202._8_4_ = auVar2._8_4_ * fVar195;
                auVar202._12_4_ = auVar2._12_4_ * fVar195;
                auVar87 = vsubps_avx(auVar180,auVar202);
                fVar195 = auVar88._0_4_ * (float)local_720._0_4_;
                auVar227 = vmaxss_avx(ZEXT416((uint)fVar246),
                                      ZEXT416((uint)(fVar249 * fVar248 * 1.9073486e-06)));
                auVar21._8_4_ = 0x80000000;
                auVar21._0_8_ = 0x8000000080000000;
                auVar21._12_4_ = 0x80000000;
                auVar135._16_16_ = auVar97._16_16_;
                auVar92 = vxorps_avx512vl(auVar2,auVar21);
                auVar203._0_4_ = fVar250 * auVar87._0_4_ * fVar195;
                auVar203._4_4_ = fVar215 * auVar87._4_4_ * fVar195;
                auVar203._8_4_ = fVar237 * auVar87._8_4_ * fVar195;
                auVar203._12_4_ = fVar238 * auVar87._12_4_ * fVar195;
                auVar87 = vdpps_avx(auVar92,auVar152,0x7f);
                auVar88 = vfmadd213ss_fma(auVar85,ZEXT416((uint)fVar246),auVar227);
                auVar85 = vdpps_avx(local_820._0_16_,auVar203,0x7f);
                auVar86 = vfmadd213ss_fma(ZEXT416((uint)(fVar173 + 1.0)),
                                          ZEXT416((uint)(fVar246 / fVar252)),auVar88);
                auVar263 = ZEXT1664(auVar86);
                fVar250 = auVar87._0_4_ + auVar85._0_4_;
                auVar85 = vdpps_avx(local_7f0,auVar152,0x7f);
                auVar87 = vdpps_avx(local_820._0_16_,auVar92,0x7f);
                auVar88 = vmulss_avx512f(auVar91,auVar89);
                auVar91 = vaddss_avx512f(auVar90,ZEXT416((uint)(auVar88._0_4_ *
                                                               auVar89._0_4_ * auVar89._0_4_)));
                auVar88 = vdpps_avx(local_820._0_16_,local_7f0,0x7f);
                auVar89 = vfnmadd231ss_fma(auVar87,auVar3,ZEXT416((uint)fVar250));
                auVar90 = vfnmadd231ss_fma(auVar88,auVar3,auVar85);
                auVar87 = vpermilps_avx(local_6c0._0_16_,0xff);
                fVar253 = fVar253 - auVar87._0_4_;
                auVar87 = vshufps_avx(auVar2,auVar2,0xff);
                auVar88 = vfmsub213ss_fma(auVar89,auVar91,auVar87);
                fVar252 = auVar90._0_4_ * auVar91._0_4_;
                auVar89 = vfmsub231ss_fma(ZEXT416((uint)(auVar85._0_4_ * auVar88._0_4_)),
                                          ZEXT416((uint)fVar250),ZEXT416((uint)fVar252));
                fVar173 = auVar89._0_4_;
                fVar252 = fVar251 * (fVar252 / fVar173) - fVar253 * (auVar85._0_4_ / fVar173);
                auVar240 = ZEXT464((uint)fVar252);
                fVar254 = fVar254 - fVar252;
                auVar255 = ZEXT464((uint)fVar254);
                fVar249 = fVar249 - (fVar253 * (fVar250 / fVar173) -
                                    fVar251 * (auVar88._0_4_ / fVar173));
                auVar245 = ZEXT464((uint)fVar249);
                auVar229._8_4_ = 0x7fffffff;
                auVar229._0_8_ = 0x7fffffff7fffffff;
                auVar229._12_4_ = 0x7fffffff;
                auVar85 = vandps_avx(auVar3,auVar229);
                bVar82 = true;
                if (auVar85._0_4_ < auVar86._0_4_) {
                  auVar88 = vfmadd231ss_fma(ZEXT416((uint)(auVar86._0_4_ + auVar227._0_4_)),
                                            local_760,ZEXT416(0x36000000));
                  auVar85 = vandps_avx(ZEXT416((uint)fVar253),auVar229);
                  if (auVar85._0_4_ < auVar88._0_4_) {
                    fVar249 = fVar249 + (float)local_750._0_4_;
                    auVar245 = ZEXT464((uint)fVar249);
                    if (fVar148 <= fVar249) {
                      fVar250 = *(float *)(ray + k * 4 + 0x80);
                      auVar240 = ZEXT464((uint)fVar250);
                      if (((fVar249 <= fVar250) && (0.0 <= fVar254)) && (fVar254 <= 1.0)) {
                        auVar135._0_16_ = ZEXT816(0) << 0x20;
                        auVar134._4_28_ = auVar135._4_28_;
                        auVar134._0_4_ = local_840._0_4_;
                        auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar134._0_16_);
                        fVar251 = auVar85._0_4_;
                        auVar85 = vmulss_avx512f(local_840._0_16_,ZEXT416(0xbf000000));
                        pGVar5 = (context->scene->geometries).items[local_878].ptr;
                        if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                            bVar79 = true;
                          }
                          else {
                            fVar251 = fVar251 * 1.5 + auVar85._0_4_ * fVar251 * fVar251 * fVar251;
                            auVar181._0_4_ = local_820._0_4_ * fVar251;
                            auVar181._4_4_ = local_820._4_4_ * fVar251;
                            auVar181._8_4_ = local_820._8_4_ * fVar251;
                            auVar181._12_4_ = local_820._12_4_ * fVar251;
                            auVar3 = vfmadd213ps_fma(auVar87,auVar181,auVar2);
                            auVar85 = vshufps_avx(auVar181,auVar181,0xc9);
                            auVar87 = vshufps_avx(auVar2,auVar2,0xc9);
                            auVar182._0_4_ = auVar181._0_4_ * auVar87._0_4_;
                            auVar182._4_4_ = auVar181._4_4_ * auVar87._4_4_;
                            auVar182._8_4_ = auVar181._8_4_ * auVar87._8_4_;
                            auVar182._12_4_ = auVar181._12_4_ * auVar87._12_4_;
                            auVar88 = vfmsub231ps_fma(auVar182,auVar2,auVar85);
                            auVar85 = vshufps_avx(auVar88,auVar88,0xc9);
                            auVar87 = vshufps_avx(auVar3,auVar3,0xc9);
                            auVar88 = vshufps_avx(auVar88,auVar88,0xd2);
                            auVar154._0_4_ = auVar3._0_4_ * auVar88._0_4_;
                            auVar154._4_4_ = auVar3._4_4_ * auVar88._4_4_;
                            auVar154._8_4_ = auVar3._8_4_ * auVar88._8_4_;
                            auVar154._12_4_ = auVar3._12_4_ * auVar88._12_4_;
                            auVar85 = vfmsub231ps_fma(auVar154,auVar85,auVar87);
                            local_660 = (RTCHitN  [16])vshufps_avx(auVar85,auVar85,0x55);
                            auStack_650 = vshufps_avx(auVar85,auVar85,0xaa);
                            local_640 = auVar85._0_4_;
                            uStack_63c = local_640;
                            uStack_638 = local_640;
                            uStack_634 = local_640;
                            local_630 = fVar254;
                            fStack_62c = fVar254;
                            fStack_628 = fVar254;
                            fStack_624 = fVar254;
                            local_620 = ZEXT416(0) << 0x20;
                            local_610 = local_670._0_8_;
                            uStack_608 = local_670._8_8_;
                            local_600 = local_680;
                            vpcmpeqd_avx2(ZEXT1632(local_680),ZEXT1632(local_680));
                            uStack_5ec = context->user->instID[0];
                            local_5f0 = uStack_5ec;
                            uStack_5e8 = uStack_5ec;
                            uStack_5e4 = uStack_5ec;
                            uStack_5e0 = context->user->instPrimID[0];
                            uStack_5dc = uStack_5e0;
                            uStack_5d8 = uStack_5e0;
                            uStack_5d4 = uStack_5e0;
                            *(float *)(ray + k * 4 + 0x80) = fVar249;
                            local_8f0 = local_690._0_8_;
                            uStack_8e8 = local_690._8_8_;
                            local_870.valid = (int *)&local_8f0;
                            local_870.geometryUserPtr = pGVar5->userPtr;
                            local_870.context = context->user;
                            local_870.hit = local_660;
                            local_870.N = 4;
                            local_870.ray = (RTCRayN *)ray;
                            if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar247 = ZEXT1664(local_820._0_16_);
                              auVar261 = ZEXT1664(auVar2);
                              auVar263 = ZEXT1664(auVar86);
                              (*pGVar5->occlusionFilterN)(&local_870);
                              auVar245 = ZEXT1664(ZEXT416((uint)fVar249));
                              auVar255 = ZEXT1664(ZEXT416((uint)fVar254));
                              auVar229._8_4_ = 0x7fffffff;
                              auVar229._0_8_ = 0x7fffffff7fffffff;
                              auVar229._12_4_ = 0x7fffffff;
                              auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar265 = ZEXT3264(auVar97);
                            }
                            auVar65._8_8_ = uStack_8e8;
                            auVar65._0_8_ = local_8f0;
                            uVar83 = vptestmd_avx512vl(auVar65,auVar65);
                            if ((uVar83 & 0xf) == 0) {
                              bVar79 = false;
                            }
                            else {
                              p_Var9 = context->args->filter;
                              if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar247 = ZEXT1664(auVar247._0_16_);
                                auVar261 = ZEXT1664(auVar261._0_16_);
                                auVar263 = ZEXT1664(auVar263._0_16_);
                                (*p_Var9)(&local_870);
                                auVar245 = ZEXT1664(ZEXT416((uint)fVar249));
                                auVar255 = ZEXT1664(ZEXT416((uint)fVar254));
                                auVar229._8_4_ = 0x7fffffff;
                                auVar229._0_8_ = 0x7fffffff7fffffff;
                                auVar229._12_4_ = 0x7fffffff;
                                auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar265 = ZEXT3264(auVar97);
                              }
                              auVar66._8_8_ = uStack_8e8;
                              auVar66._0_8_ = local_8f0;
                              uVar83 = vptestmd_avx512vl(auVar66,auVar66);
                              uVar83 = uVar83 & 0xf;
                              auVar85 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                              bVar82 = (bool)((byte)uVar83 & 1);
                              bVar10 = (bool)((byte)(uVar83 >> 1) & 1);
                              bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
                              bVar12 = SUB81(uVar83 >> 3,0);
                              *(uint *)(local_870.ray + 0x80) =
                                   (uint)bVar82 * auVar85._0_4_ |
                                   (uint)!bVar82 * *(int *)(local_870.ray + 0x80);
                              *(uint *)(local_870.ray + 0x84) =
                                   (uint)bVar10 * auVar85._4_4_ |
                                   (uint)!bVar10 * *(int *)(local_870.ray + 0x84);
                              *(uint *)(local_870.ray + 0x88) =
                                   (uint)bVar11 * auVar85._8_4_ |
                                   (uint)!bVar11 * *(int *)(local_870.ray + 0x88);
                              *(uint *)(local_870.ray + 0x8c) =
                                   (uint)bVar12 * auVar85._12_4_ |
                                   (uint)!bVar12 * *(int *)(local_870.ray + 0x8c);
                              bVar79 = (byte)uVar83 != 0;
                            }
                            if ((bool)bVar79 == false) {
                              *(float *)(ray + k * 4 + 0x80) = fVar250;
                            }
                          }
                          auVar240 = ZEXT464((uint)fVar250);
                          bVar82 = false;
                          goto LAB_01e9aa1c;
                        }
                      }
                    }
                    bVar82 = false;
                    bVar79 = 0;
                  }
                }
LAB_01e9aa1c:
                if (!bVar82) goto LAB_01e9ad2c;
                lVar81 = lVar81 + -1;
              } while (lVar81 != 0);
              bVar79 = 0;
LAB_01e9ad2c:
              bVar78 = bVar78 | bVar79 & 1;
              auVar71._4_4_ = fStack_57c;
              auVar71._0_4_ = local_580;
              auVar71._8_4_ = fStack_578;
              auVar71._12_4_ = fStack_574;
              auVar71._16_4_ = fStack_570;
              auVar71._20_4_ = fStack_56c;
              auVar71._24_4_ = fStack_568;
              auVar71._28_4_ = fStack_564;
              uVar149 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar31._4_4_ = uVar149;
              auVar31._0_4_ = uVar149;
              auVar31._8_4_ = uVar149;
              auVar31._12_4_ = uVar149;
              auVar31._16_4_ = uVar149;
              auVar31._20_4_ = uVar149;
              auVar31._24_4_ = uVar149;
              auVar31._28_4_ = uVar149;
              uVar17 = vcmpps_avx512vl(auVar71,auVar31,2);
              bVar77 = bVar75 & bVar77 & (byte)uVar17;
            } while (bVar77 != 0);
          }
          auVar164._0_4_ = (float)local_5c0._0_4_ + (float)local_5a0._0_4_;
          auVar164._4_4_ = (float)local_5c0._4_4_ + (float)local_5a0._4_4_;
          auVar164._8_4_ = fStack_5b8 + fStack_598;
          auVar164._12_4_ = fStack_5b4 + fStack_594;
          auVar164._16_4_ = fStack_5b0 + fStack_590;
          auVar164._20_4_ = fStack_5ac + fStack_58c;
          auVar164._24_4_ = fStack_5a8 + fStack_588;
          auVar164._28_4_ = fStack_5a4 + fStack_584;
          uVar149 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar32._4_4_ = uVar149;
          auVar32._0_4_ = uVar149;
          auVar32._8_4_ = uVar149;
          auVar32._12_4_ = uVar149;
          auVar32._16_4_ = uVar149;
          auVar32._20_4_ = uVar149;
          auVar32._24_4_ = uVar149;
          auVar32._28_4_ = uVar149;
          uVar17 = vcmpps_avx512vl(auVar164,auVar32,2);
          bVar79 = (byte)local_8cc | (byte)local_8d4;
          bVar74 = (byte)uVar18 & bVar74 & (byte)uVar17;
          auVar165._8_4_ = 2;
          auVar165._0_8_ = 0x200000002;
          auVar165._12_4_ = 2;
          auVar165._16_4_ = 2;
          auVar165._20_4_ = 2;
          auVar165._24_4_ = 2;
          auVar165._28_4_ = 2;
          auVar33._8_4_ = 3;
          auVar33._0_8_ = 0x300000003;
          auVar33._12_4_ = 3;
          auVar33._16_4_ = 3;
          auVar33._20_4_ = 3;
          auVar33._24_4_ = 3;
          auVar33._28_4_ = 3;
          auVar97 = vpblendmd_avx512vl(auVar165,auVar33);
          local_5a0._0_4_ = (uint)(bVar79 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar79 & 1) * 2;
          bVar82 = (bool)(bVar79 >> 1 & 1);
          local_5a0._4_4_ = (uint)bVar82 * auVar97._4_4_ | (uint)!bVar82 * 2;
          bVar82 = (bool)(bVar79 >> 2 & 1);
          fStack_598 = (float)((uint)bVar82 * auVar97._8_4_ | (uint)!bVar82 * 2);
          bVar82 = (bool)(bVar79 >> 3 & 1);
          fStack_594 = (float)((uint)bVar82 * auVar97._12_4_ | (uint)!bVar82 * 2);
          bVar82 = (bool)(bVar79 >> 4 & 1);
          fStack_590 = (float)((uint)bVar82 * auVar97._16_4_ | (uint)!bVar82 * 2);
          bVar82 = (bool)(bVar79 >> 5 & 1);
          fStack_58c = (float)((uint)bVar82 * auVar97._20_4_ | (uint)!bVar82 * 2);
          bVar82 = (bool)(bVar79 >> 6 & 1);
          fStack_588 = (float)((uint)bVar82 * auVar97._24_4_ | (uint)!bVar82 * 2);
          fStack_584 = (float)((uint)(bVar79 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar79 >> 7) * 2
                              );
          uVar17 = vpcmpd_avx512vl(_local_5a0,local_520,2);
          bVar79 = (byte)uVar17 & bVar74;
          if (bVar79 != 0) {
            auVar87 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar85 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar88 = vminps_avx(local_7a0._0_16_,local_7e0._0_16_);
            auVar2 = vminps_avx(auVar87,auVar88);
            auVar87 = vmaxps_avx(local_7a0._0_16_,local_7e0._0_16_);
            auVar88 = vmaxps_avx(auVar85,auVar87);
            auVar85 = vandps_avx(auVar2,auVar229);
            auVar87 = vandps_avx(auVar88,auVar229);
            auVar85 = vmaxps_avx(auVar85,auVar87);
            auVar87 = vmovshdup_avx(auVar85);
            auVar87 = vmaxss_avx(auVar87,auVar85);
            auVar85 = vshufpd_avx(auVar85,auVar85,1);
            auVar85 = vmaxss_avx(auVar85,auVar87);
            fVar246 = auVar85._0_4_ * 1.9073486e-06;
            local_760 = vshufps_avx(auVar88,auVar88,0xff);
            _local_6e0 = _local_480;
            local_580 = (float)local_5c0._0_4_ + (float)local_480._0_4_;
            fStack_57c = (float)local_5c0._4_4_ + (float)local_480._4_4_;
            fStack_578 = fStack_5b8 + fStack_478;
            fStack_574 = fStack_5b4 + fStack_474;
            fStack_570 = fStack_5b0 + fStack_470;
            fStack_56c = fStack_5ac + fStack_46c;
            fStack_568 = fStack_5a8 + fStack_468;
            fStack_564 = fStack_5a4 + fStack_464;
            do {
              auVar166._8_4_ = 0x7f800000;
              auVar166._0_8_ = 0x7f8000007f800000;
              auVar166._12_4_ = 0x7f800000;
              auVar166._16_4_ = 0x7f800000;
              auVar166._20_4_ = 0x7f800000;
              auVar166._24_4_ = 0x7f800000;
              auVar166._28_4_ = 0x7f800000;
              auVar97 = vblendmps_avx512vl(auVar166,_local_6e0);
              auVar136._0_4_ =
                   (uint)(bVar79 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000;
              bVar82 = (bool)(bVar79 >> 1 & 1);
              auVar136._4_4_ = (uint)bVar82 * auVar97._4_4_ | (uint)!bVar82 * 0x7f800000;
              bVar82 = (bool)(bVar79 >> 2 & 1);
              auVar136._8_4_ = (uint)bVar82 * auVar97._8_4_ | (uint)!bVar82 * 0x7f800000;
              bVar82 = (bool)(bVar79 >> 3 & 1);
              auVar136._12_4_ = (uint)bVar82 * auVar97._12_4_ | (uint)!bVar82 * 0x7f800000;
              bVar82 = (bool)(bVar79 >> 4 & 1);
              auVar136._16_4_ = (uint)bVar82 * auVar97._16_4_ | (uint)!bVar82 * 0x7f800000;
              bVar82 = (bool)(bVar79 >> 5 & 1);
              auVar136._20_4_ = (uint)bVar82 * auVar97._20_4_ | (uint)!bVar82 * 0x7f800000;
              auVar136._24_4_ =
                   (uint)(bVar79 >> 6) * auVar97._24_4_ | (uint)!(bool)(bVar79 >> 6) * 0x7f800000;
              auVar136._28_4_ = 0x7f800000;
              auVar97 = vshufps_avx(auVar136,auVar136,0xb1);
              auVar97 = vminps_avx(auVar136,auVar97);
              auVar98 = vshufpd_avx(auVar97,auVar97,5);
              auVar97 = vminps_avx(auVar97,auVar98);
              auVar98 = vpermpd_avx2(auVar97,0x4e);
              auVar97 = vminps_avx(auVar97,auVar98);
              uVar17 = vcmpps_avx512vl(auVar136,auVar97,0);
              bVar75 = (byte)uVar17 & bVar79;
              bVar77 = bVar79;
              if (bVar75 != 0) {
                bVar77 = bVar75;
              }
              iVar20 = 0;
              for (uVar84 = (uint)bVar77; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
                iVar20 = iVar20 + 1;
              }
              bVar77 = '\x01' << ((byte)iVar20 & 0x1f);
              uVar84 = *(uint *)(local_560 + (uint)(iVar20 << 2));
              uVar141 = *(uint *)(local_460 + (uint)(iVar20 << 2));
              fVar248 = local_8c4;
              if ((float)local_800._0_4_ < 0.0) {
                fVar248 = sqrtf((float)local_800._0_4_);
              }
              auVar255 = ZEXT464(uVar84);
              auVar245 = ZEXT464(uVar141);
              bVar75 = ~bVar77;
              lVar81 = 5;
              do {
                fVar249 = auVar245._0_4_;
                auVar155._4_4_ = fVar249;
                auVar155._0_4_ = fVar249;
                auVar155._8_4_ = fVar249;
                auVar155._12_4_ = fVar249;
                auVar85 = vfmadd132ps_fma(auVar155,ZEXT816(0) << 0x40,local_7f0);
                fVar254 = auVar255._0_4_;
                fVar237 = 1.0 - fVar254;
                fVar252 = fVar237 * fVar237 * fVar237;
                fVar250 = fVar254 * fVar254;
                fVar215 = fVar254 * fVar250;
                auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar252),
                                          ZEXT416((uint)fVar215));
                fVar251 = fVar254 * fVar237;
                auVar227 = ZEXT416((uint)fVar237);
                auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar254 * fVar251 * 6.0)),
                                         ZEXT416((uint)(fVar251 * fVar237)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar215),
                                          ZEXT416((uint)fVar252));
                auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar237 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar254 * fVar251)));
                fVar252 = fVar252 * 0.16666667;
                fVar253 = (auVar87._0_4_ + auVar2._0_4_) * 0.16666667;
                fVar173 = (auVar88._0_4_ + auVar3._0_4_) * 0.16666667;
                fVar215 = fVar215 * 0.16666667;
                auVar204._0_4_ = fVar215 * (float)local_7e0._0_4_;
                auVar204._4_4_ = fVar215 * (float)local_7e0._4_4_;
                auVar204._8_4_ = fVar215 * fStack_7d8;
                auVar204._12_4_ = fVar215 * fStack_7d4;
                auVar230._4_4_ = fVar173;
                auVar230._0_4_ = fVar173;
                auVar230._8_4_ = fVar173;
                auVar230._12_4_ = fVar173;
                auVar87 = vfmadd132ps_fma(auVar230,auVar204,local_7a0._0_16_);
                auVar205._4_4_ = fVar253;
                auVar205._0_4_ = fVar253;
                auVar205._8_4_ = fVar253;
                auVar205._12_4_ = fVar253;
                auVar87 = vfmadd132ps_fma(auVar205,auVar87,local_7c0._0_16_);
                auVar183._4_4_ = fVar252;
                auVar183._0_4_ = fVar252;
                auVar183._8_4_ = fVar252;
                auVar183._12_4_ = fVar252;
                auVar87 = vfmadd132ps_fma(auVar183,auVar87,local_780._0_16_);
                local_6c0._0_16_ = auVar87;
                auVar85 = vsubps_avx(auVar85,auVar87);
                local_820._0_16_ = auVar85;
                auVar85 = vdpps_avx(auVar85,auVar85,0x7f);
                auVar87 = auVar255._0_16_;
                local_840._0_16_ = auVar85;
                if (auVar85._0_4_ < 0.0) {
                  local_8c0._0_4_ = fVar250;
                  auVar240._0_4_ = sqrtf(auVar85._0_4_);
                  auVar240._4_60_ = extraout_var_00;
                  auVar85 = auVar240._0_16_;
                }
                else {
                  auVar85 = vsqrtss_avx(auVar85,auVar85);
                  local_8c0._0_4_ = fVar250;
                }
                auVar2 = vfnmsub213ss_fma(auVar87,auVar87,ZEXT416((uint)(fVar251 * 4.0)));
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * 4.0)),auVar227,auVar227);
                fVar250 = fVar237 * -fVar237 * 0.5;
                fVar251 = auVar2._0_4_ * 0.5;
                fVar252 = auVar88._0_4_ * 0.5;
                local_8c0._0_4_ = (float)local_8c0._0_4_ * 0.5;
                auVar219._0_4_ = (float)local_8c0._0_4_ * (float)local_7e0._0_4_;
                auVar219._4_4_ = (float)local_8c0._0_4_ * (float)local_7e0._4_4_;
                auVar219._8_4_ = (float)local_8c0._0_4_ * fStack_7d8;
                auVar219._12_4_ = (float)local_8c0._0_4_ * fStack_7d4;
                auVar184._4_4_ = fVar252;
                auVar184._0_4_ = fVar252;
                auVar184._8_4_ = fVar252;
                auVar184._12_4_ = fVar252;
                auVar88 = vfmadd132ps_fma(auVar184,auVar219,local_7a0._0_16_);
                auVar206._4_4_ = fVar251;
                auVar206._0_4_ = fVar251;
                auVar206._8_4_ = fVar251;
                auVar206._12_4_ = fVar251;
                auVar88 = vfmadd132ps_fma(auVar206,auVar88,local_7c0._0_16_);
                auVar260._4_4_ = fVar250;
                auVar260._0_4_ = fVar250;
                auVar260._8_4_ = fVar250;
                auVar260._12_4_ = fVar250;
                local_8c0._0_16_ = vfmadd132ps_fma(auVar260,auVar88,local_780._0_16_);
                local_710 = vdpps_avx(local_8c0._0_16_,local_8c0._0_16_,0x7f);
                auVar64._12_4_ = 0;
                auVar64._0_12_ = ZEXT812(0);
                fVar250 = local_710._0_4_;
                auVar88 = vrsqrt14ss_avx512f(auVar64 << 0x20,ZEXT416((uint)fVar250));
                fVar251 = auVar88._0_4_;
                local_720 = vrcp14ss_avx512f(auVar64 << 0x20,ZEXT416((uint)fVar250));
                auVar88 = vfnmadd213ss_fma(local_720,local_710,ZEXT416(0x40000000));
                uVar84 = auVar85._0_4_;
                local_700 = fVar237;
                fStack_6fc = fVar237;
                fStack_6f8 = fVar237;
                fStack_6f4 = fVar237;
                if (fVar250 < -fVar250) {
                  fVar252 = sqrtf(fVar250);
                  auVar85 = ZEXT416(uVar84);
                  auVar2 = local_8c0._0_16_;
                }
                else {
                  auVar2 = vsqrtss_avx(local_710,local_710);
                  fVar252 = auVar2._0_4_;
                  auVar2 = local_8c0._0_16_;
                }
                fVar250 = fVar251 * 1.5 + fVar250 * -0.5 * fVar251 * fVar251 * fVar251;
                auVar156._0_4_ = auVar2._0_4_ * fVar250;
                auVar156._4_4_ = auVar2._4_4_ * fVar250;
                auVar156._8_4_ = auVar2._8_4_ * fVar250;
                auVar156._12_4_ = auVar2._12_4_ * fVar250;
                auVar3 = vdpps_avx(local_820._0_16_,auVar156,0x7f);
                fVar173 = auVar85._0_4_;
                fVar251 = auVar3._0_4_;
                auVar157._0_4_ = fVar251 * fVar251;
                auVar157._4_4_ = auVar3._4_4_ * auVar3._4_4_;
                auVar157._8_4_ = auVar3._8_4_ * auVar3._8_4_;
                auVar157._12_4_ = auVar3._12_4_ * auVar3._12_4_;
                auVar86 = vsubps_avx512vl(local_840._0_16_,auVar157);
                fVar253 = auVar86._0_4_;
                auVar185._4_12_ = ZEXT812(0) << 0x20;
                auVar185._0_4_ = fVar253;
                auVar89 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar185);
                auVar90 = vmulss_avx512f(auVar89,ZEXT416(0x3fc00000));
                auVar91 = vmulss_avx512f(auVar86,ZEXT416(0xbf000000));
                if (fVar253 < 0.0) {
                  local_740 = fVar250;
                  fStack_73c = fVar250;
                  fStack_738 = fVar250;
                  fStack_734 = fVar250;
                  local_730 = auVar89;
                  fVar253 = sqrtf(fVar253);
                  auVar91 = ZEXT416(auVar91._0_4_);
                  auVar90 = ZEXT416(auVar90._0_4_);
                  auVar85 = ZEXT416(uVar84);
                  auVar2 = local_8c0._0_16_;
                  auVar89 = local_730;
                  fVar250 = local_740;
                  fVar215 = fStack_73c;
                  fVar237 = fStack_738;
                  fVar238 = fStack_734;
                }
                else {
                  auVar86 = vsqrtss_avx(auVar86,auVar86);
                  fVar253 = auVar86._0_4_;
                  fVar215 = fVar250;
                  fVar237 = fVar250;
                  fVar238 = fVar250;
                }
                auVar261 = ZEXT1664(auVar2);
                auVar247 = ZEXT1664(local_820._0_16_);
                auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar265 = ZEXT3264(auVar97);
                auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar227,auVar87);
                auVar87 = vfmadd231ss_fma(auVar227,auVar87,SUB6416(ZEXT464(0xc0000000),0));
                auVar207._0_4_ = fVar254 * (float)local_7e0._0_4_;
                auVar207._4_4_ = fVar254 * (float)local_7e0._4_4_;
                auVar207._8_4_ = fVar254 * fStack_7d8;
                auVar207._12_4_ = fVar254 * fStack_7d4;
                auVar220._0_4_ = auVar87._0_4_;
                auVar220._4_4_ = auVar220._0_4_;
                auVar220._8_4_ = auVar220._0_4_;
                auVar220._12_4_ = auVar220._0_4_;
                auVar87 = vfmadd132ps_fma(auVar220,auVar207,local_7a0._0_16_);
                auVar186._0_4_ = auVar86._0_4_;
                auVar186._4_4_ = auVar186._0_4_;
                auVar186._8_4_ = auVar186._0_4_;
                auVar186._12_4_ = auVar186._0_4_;
                auVar87 = vfmadd132ps_fma(auVar186,auVar87,local_7c0._0_16_);
                auVar70._4_4_ = fStack_6fc;
                auVar70._0_4_ = local_700;
                auVar70._8_4_ = fStack_6f8;
                auVar70._12_4_ = fStack_6f4;
                auVar87 = vfmadd132ps_fma(auVar70,auVar87,local_780._0_16_);
                auVar187._0_4_ = auVar87._0_4_ * (float)local_710._0_4_;
                auVar187._4_4_ = auVar87._4_4_ * (float)local_710._0_4_;
                auVar187._8_4_ = auVar87._8_4_ * (float)local_710._0_4_;
                auVar187._12_4_ = auVar87._12_4_ * (float)local_710._0_4_;
                auVar87 = vdpps_avx(auVar2,auVar87,0x7f);
                fVar195 = auVar87._0_4_;
                auVar208._0_4_ = auVar2._0_4_ * fVar195;
                auVar208._4_4_ = auVar2._4_4_ * fVar195;
                auVar208._8_4_ = auVar2._8_4_ * fVar195;
                auVar208._12_4_ = auVar2._12_4_ * fVar195;
                auVar87 = vsubps_avx(auVar187,auVar208);
                fVar195 = auVar88._0_4_ * (float)local_720._0_4_;
                auVar227 = vmaxss_avx(ZEXT416((uint)fVar246),
                                      ZEXT416((uint)(fVar249 * fVar248 * 1.9073486e-06)));
                auVar22._8_4_ = 0x80000000;
                auVar22._0_8_ = 0x8000000080000000;
                auVar22._12_4_ = 0x80000000;
                auVar138._16_16_ = auVar97._16_16_;
                auVar92 = vxorps_avx512vl(auVar2,auVar22);
                auVar209._0_4_ = fVar250 * auVar87._0_4_ * fVar195;
                auVar209._4_4_ = fVar215 * auVar87._4_4_ * fVar195;
                auVar209._8_4_ = fVar237 * auVar87._8_4_ * fVar195;
                auVar209._12_4_ = fVar238 * auVar87._12_4_ * fVar195;
                auVar87 = vdpps_avx(auVar92,auVar156,0x7f);
                auVar88 = vfmadd213ss_fma(auVar85,ZEXT416((uint)fVar246),auVar227);
                auVar85 = vdpps_avx(local_820._0_16_,auVar209,0x7f);
                auVar86 = vfmadd213ss_fma(ZEXT416((uint)(fVar173 + 1.0)),
                                          ZEXT416((uint)(fVar246 / fVar252)),auVar88);
                auVar263 = ZEXT1664(auVar86);
                fVar250 = auVar87._0_4_ + auVar85._0_4_;
                auVar85 = vdpps_avx(local_7f0,auVar156,0x7f);
                auVar87 = vdpps_avx(local_820._0_16_,auVar92,0x7f);
                auVar88 = vmulss_avx512f(auVar91,auVar89);
                auVar91 = vaddss_avx512f(auVar90,ZEXT416((uint)(auVar88._0_4_ *
                                                               auVar89._0_4_ * auVar89._0_4_)));
                auVar88 = vdpps_avx(local_820._0_16_,local_7f0,0x7f);
                auVar89 = vfnmadd231ss_fma(auVar87,auVar3,ZEXT416((uint)fVar250));
                auVar90 = vfnmadd231ss_fma(auVar88,auVar3,auVar85);
                auVar87 = vpermilps_avx(local_6c0._0_16_,0xff);
                fVar253 = fVar253 - auVar87._0_4_;
                auVar87 = vshufps_avx(auVar2,auVar2,0xff);
                auVar88 = vfmsub213ss_fma(auVar89,auVar91,auVar87);
                fVar252 = auVar90._0_4_ * auVar91._0_4_;
                auVar89 = vfmsub231ss_fma(ZEXT416((uint)(auVar85._0_4_ * auVar88._0_4_)),
                                          ZEXT416((uint)fVar250),ZEXT416((uint)fVar252));
                fVar173 = auVar89._0_4_;
                fVar252 = fVar251 * (fVar252 / fVar173) - fVar253 * (auVar85._0_4_ / fVar173);
                auVar240 = ZEXT464((uint)fVar252);
                fVar254 = fVar254 - fVar252;
                auVar255 = ZEXT464((uint)fVar254);
                fVar249 = fVar249 - (fVar253 * (fVar250 / fVar173) -
                                    fVar251 * (auVar88._0_4_ / fVar173));
                auVar245 = ZEXT464((uint)fVar249);
                auVar231._8_4_ = 0x7fffffff;
                auVar231._0_8_ = 0x7fffffff7fffffff;
                auVar231._12_4_ = 0x7fffffff;
                auVar85 = vandps_avx(auVar3,auVar231);
                bVar82 = true;
                if (auVar85._0_4_ < auVar86._0_4_) {
                  auVar88 = vfmadd231ss_fma(ZEXT416((uint)(auVar86._0_4_ + auVar227._0_4_)),
                                            local_760,ZEXT416(0x36000000));
                  auVar85 = vandps_avx(ZEXT416((uint)fVar253),auVar231);
                  if (auVar85._0_4_ < auVar88._0_4_) {
                    fVar249 = fVar249 + (float)local_750._0_4_;
                    auVar245 = ZEXT464((uint)fVar249);
                    if ((((fVar148 <= fVar249) &&
                         (fVar250 = *(float *)(ray + k * 4 + 0x80), fVar249 <= fVar250)) &&
                        (0.0 <= fVar254)) && (fVar254 <= 1.0)) {
                      auVar138._0_16_ = ZEXT816(0) << 0x20;
                      auVar137._4_28_ = auVar138._4_28_;
                      auVar137._0_4_ = local_840._0_4_;
                      auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar137._0_16_);
                      fVar251 = auVar85._0_4_;
                      auVar85 = vmulss_avx512f(local_840._0_16_,ZEXT416(0xbf000000));
                      pGVar5 = (context->scene->geometries).items[local_878].ptr;
                      if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          bVar77 = true;
                        }
                        else {
                          fVar251 = fVar251 * 1.5 + auVar85._0_4_ * fVar251 * fVar251 * fVar251;
                          auVar188._0_4_ = local_820._0_4_ * fVar251;
                          auVar188._4_4_ = local_820._4_4_ * fVar251;
                          auVar188._8_4_ = local_820._8_4_ * fVar251;
                          auVar188._12_4_ = local_820._12_4_ * fVar251;
                          auVar3 = vfmadd213ps_fma(auVar87,auVar188,auVar2);
                          auVar85 = vshufps_avx(auVar188,auVar188,0xc9);
                          auVar87 = vshufps_avx(auVar2,auVar2,0xc9);
                          auVar189._0_4_ = auVar188._0_4_ * auVar87._0_4_;
                          auVar189._4_4_ = auVar188._4_4_ * auVar87._4_4_;
                          auVar189._8_4_ = auVar188._8_4_ * auVar87._8_4_;
                          auVar189._12_4_ = auVar188._12_4_ * auVar87._12_4_;
                          auVar88 = vfmsub231ps_fma(auVar189,auVar2,auVar85);
                          auVar85 = vshufps_avx(auVar88,auVar88,0xc9);
                          auVar87 = vshufps_avx(auVar3,auVar3,0xc9);
                          auVar88 = vshufps_avx(auVar88,auVar88,0xd2);
                          auVar158._0_4_ = auVar3._0_4_ * auVar88._0_4_;
                          auVar158._4_4_ = auVar3._4_4_ * auVar88._4_4_;
                          auVar158._8_4_ = auVar3._8_4_ * auVar88._8_4_;
                          auVar158._12_4_ = auVar3._12_4_ * auVar88._12_4_;
                          auVar85 = vfmsub231ps_fma(auVar158,auVar85,auVar87);
                          local_660 = (RTCHitN  [16])vshufps_avx(auVar85,auVar85,0x55);
                          auStack_650 = vshufps_avx(auVar85,auVar85,0xaa);
                          local_640 = auVar85._0_4_;
                          uStack_63c = local_640;
                          uStack_638 = local_640;
                          uStack_634 = local_640;
                          local_630 = fVar254;
                          fStack_62c = fVar254;
                          fStack_628 = fVar254;
                          fStack_624 = fVar254;
                          local_620 = ZEXT416(0) << 0x20;
                          local_610 = local_670._0_8_;
                          uStack_608 = local_670._8_8_;
                          local_600 = local_680;
                          vpcmpeqd_avx2(ZEXT1632(local_680),ZEXT1632(local_680));
                          uStack_5ec = context->user->instID[0];
                          local_5f0 = uStack_5ec;
                          uStack_5e8 = uStack_5ec;
                          uStack_5e4 = uStack_5ec;
                          uStack_5e0 = context->user->instPrimID[0];
                          uStack_5dc = uStack_5e0;
                          uStack_5d8 = uStack_5e0;
                          uStack_5d4 = uStack_5e0;
                          *(float *)(ray + k * 4 + 0x80) = fVar249;
                          local_8f0 = local_690._0_8_;
                          uStack_8e8 = local_690._8_8_;
                          local_870.valid = (int *)&local_8f0;
                          local_870.geometryUserPtr = pGVar5->userPtr;
                          local_870.context = context->user;
                          local_870.hit = local_660;
                          local_870.N = 4;
                          local_870.ray = (RTCRayN *)ray;
                          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar240 = ZEXT464((uint)fVar252);
                            auVar247 = ZEXT1664(local_820._0_16_);
                            auVar261 = ZEXT1664(auVar2);
                            auVar263 = ZEXT1664(auVar86);
                            (*pGVar5->occlusionFilterN)(&local_870);
                            auVar245 = ZEXT1664(ZEXT416((uint)fVar249));
                            auVar255 = ZEXT1664(ZEXT416((uint)fVar254));
                            auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar265 = ZEXT3264(auVar97);
                          }
                          auVar67._8_8_ = uStack_8e8;
                          auVar67._0_8_ = local_8f0;
                          uVar83 = vptestmd_avx512vl(auVar67,auVar67);
                          if ((uVar83 & 0xf) == 0) {
                            bVar77 = false;
                          }
                          else {
                            p_Var9 = context->args->filter;
                            if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar240 = ZEXT1664(auVar240._0_16_);
                              auVar247 = ZEXT1664(auVar247._0_16_);
                              auVar261 = ZEXT1664(auVar261._0_16_);
                              auVar263 = ZEXT1664(auVar263._0_16_);
                              (*p_Var9)(&local_870);
                              auVar245 = ZEXT1664(ZEXT416((uint)fVar249));
                              auVar255 = ZEXT1664(ZEXT416((uint)fVar254));
                              auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar265 = ZEXT3264(auVar97);
                            }
                            auVar68._8_8_ = uStack_8e8;
                            auVar68._0_8_ = local_8f0;
                            uVar83 = vptestmd_avx512vl(auVar68,auVar68);
                            uVar83 = uVar83 & 0xf;
                            auVar85 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                            bVar82 = (bool)((byte)uVar83 & 1);
                            auVar93._0_4_ =
                                 (uint)bVar82 * auVar85._0_4_ |
                                 (uint)!bVar82 * *(int *)(local_870.ray + 0x80);
                            bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                            auVar93._4_4_ =
                                 (uint)bVar82 * auVar85._4_4_ |
                                 (uint)!bVar82 * *(int *)(local_870.ray + 0x84);
                            bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
                            auVar93._8_4_ =
                                 (uint)bVar82 * auVar85._8_4_ |
                                 (uint)!bVar82 * *(int *)(local_870.ray + 0x88);
                            bVar82 = SUB81(uVar83 >> 3,0);
                            auVar93._12_4_ =
                                 (uint)bVar82 * auVar85._12_4_ |
                                 (uint)!bVar82 * *(int *)(local_870.ray + 0x8c);
                            *(undefined1 (*) [16])(local_870.ray + 0x80) = auVar93;
                            bVar77 = (byte)uVar83 != 0;
                          }
                          if ((bool)bVar77 == false) {
                            *(float *)(ray + k * 4 + 0x80) = fVar250;
                          }
                        }
                        bVar82 = false;
                        goto LAB_01e9b4f1;
                      }
                    }
                    bVar82 = false;
                    bVar77 = 0;
                  }
                }
LAB_01e9b4f1:
                if (!bVar82) goto LAB_01e9b7ef;
                lVar81 = lVar81 + -1;
              } while (lVar81 != 0);
              bVar77 = 0;
LAB_01e9b7ef:
              bVar78 = bVar78 | bVar77 & 1;
              auVar72._4_4_ = fStack_57c;
              auVar72._0_4_ = local_580;
              auVar72._8_4_ = fStack_578;
              auVar72._12_4_ = fStack_574;
              auVar72._16_4_ = fStack_570;
              auVar72._20_4_ = fStack_56c;
              auVar72._24_4_ = fStack_568;
              auVar72._28_4_ = fStack_564;
              uVar149 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar34._4_4_ = uVar149;
              auVar34._0_4_ = uVar149;
              auVar34._8_4_ = uVar149;
              auVar34._12_4_ = uVar149;
              auVar34._16_4_ = uVar149;
              auVar34._20_4_ = uVar149;
              auVar34._24_4_ = uVar149;
              auVar34._28_4_ = uVar149;
              uVar17 = vcmpps_avx512vl(auVar72,auVar34,2);
              bVar79 = bVar75 & bVar79 & (byte)uVar17;
            } while (bVar79 != 0);
          }
          uVar18 = vpcmpd_avx512vl(local_520,_local_5a0,1);
          uVar19 = vpcmpd_avx512vl(local_520,local_440,1);
          auVar190._0_4_ = (float)local_5c0._0_4_ + (float)local_1c0._0_4_;
          auVar190._4_4_ = (float)local_5c0._4_4_ + (float)local_1c0._4_4_;
          auVar190._8_4_ = fStack_5b8 + fStack_1b8;
          auVar190._12_4_ = fStack_5b4 + fStack_1b4;
          auVar190._16_4_ = fStack_5b0 + fStack_1b0;
          auVar190._20_4_ = fStack_5ac + fStack_1ac;
          auVar190._24_4_ = fStack_5a8 + fStack_1a8;
          auVar190._28_4_ = fStack_5a4 + fStack_1a4;
          uVar149 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar210._4_4_ = uVar149;
          auVar210._0_4_ = uVar149;
          auVar210._8_4_ = uVar149;
          auVar210._12_4_ = uVar149;
          auVar210._16_4_ = uVar149;
          auVar210._20_4_ = uVar149;
          auVar210._24_4_ = uVar149;
          auVar210._28_4_ = uVar149;
          uVar17 = vcmpps_avx512vl(auVar190,auVar210,2);
          bVar79 = (byte)local_8d0 & (byte)uVar19 & (byte)uVar17;
          auVar224._0_4_ = (float)local_5c0._0_4_ + (float)local_480._0_4_;
          auVar224._4_4_ = (float)local_5c0._4_4_ + (float)local_480._4_4_;
          auVar224._8_4_ = fStack_5b8 + fStack_478;
          auVar224._12_4_ = fStack_5b4 + fStack_474;
          auVar224._16_4_ = fStack_5b0 + fStack_470;
          auVar224._20_4_ = fStack_5ac + fStack_46c;
          auVar224._24_4_ = fStack_5a8 + fStack_468;
          auVar224._28_4_ = fStack_5a4 + fStack_464;
          uVar17 = vcmpps_avx512vl(auVar224,auVar210,2);
          bVar74 = bVar74 & (byte)uVar18 & (byte)uVar17 | bVar79;
          if (bVar74 == 0) {
            auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,&DAT_3f8000003f800000)))))));
            auVar211 = ZEXT1664(local_8a0);
          }
          else {
            uVar83 = local_880 & 0xffffffff;
            abStack_180[uVar83 * 0x60] = bVar74;
            auVar139._0_4_ =
                 (uint)(bVar79 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar79 & 1) * local_480._0_4_;
            bVar82 = (bool)(bVar79 >> 1 & 1);
            auVar139._4_4_ = (uint)bVar82 * local_1c0._4_4_ | (uint)!bVar82 * local_480._4_4_;
            bVar82 = (bool)(bVar79 >> 2 & 1);
            auVar139._8_4_ = (uint)bVar82 * (int)fStack_1b8 | (uint)!bVar82 * (int)fStack_478;
            bVar82 = (bool)(bVar79 >> 3 & 1);
            auVar139._12_4_ = (uint)bVar82 * (int)fStack_1b4 | (uint)!bVar82 * (int)fStack_474;
            bVar82 = (bool)(bVar79 >> 4 & 1);
            auVar139._16_4_ = (uint)bVar82 * (int)fStack_1b0 | (uint)!bVar82 * (int)fStack_470;
            bVar82 = (bool)(bVar79 >> 5 & 1);
            auVar139._20_4_ = (uint)bVar82 * (int)fStack_1ac | (uint)!bVar82 * (int)fStack_46c;
            bVar82 = (bool)(bVar79 >> 6 & 1);
            auVar139._24_4_ = (uint)bVar82 * (int)fStack_1a8 | (uint)!bVar82 * (int)fStack_468;
            auVar139._28_4_ =
                 (uint)(bVar79 >> 7) * (int)fStack_1a4 |
                 (uint)!(bool)(bVar79 >> 7) * (int)fStack_464;
            *(undefined1 (*) [32])(auStack_160 + uVar83 * 0x60) = auVar139;
            auVar211 = ZEXT1664(local_8a0);
            uVar17 = vmovlps_avx(local_8a0);
            *(undefined8 *)(afStack_140 + uVar83 * 0x18) = uVar17;
            auStack_138[uVar83 * 0x18] = (int)local_888 + 1;
            auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,&DAT_3f8000003f800000)))))));
            local_880 = (ulong)((int)local_880 + 1);
          }
        }
      }
    }
    do {
      if ((int)local_880 == 0) {
        if (bVar78 != 0) {
          return local_9b9;
        }
        uVar149 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar36._4_4_ = uVar149;
        auVar36._0_4_ = uVar149;
        auVar36._8_4_ = uVar149;
        auVar36._12_4_ = uVar149;
        auVar36._16_4_ = uVar149;
        auVar36._20_4_ = uVar149;
        auVar36._24_4_ = uVar149;
        auVar36._28_4_ = uVar149;
        uVar17 = vcmpps_avx512vl(local_420,auVar36,2);
        uVar84 = (uint)uVar17 & (uint)local_6e8 - 1 & (uint)local_6e8;
        local_6e8 = (ulong)uVar84;
        local_9b9 = uVar84 != 0;
        if (!local_9b9) {
          return local_9b9;
        }
        goto LAB_01e9943e;
      }
      uVar76 = (ulong)((int)local_880 - 1);
      lVar81 = uVar76 * 0x60;
      auVar97 = *(undefined1 (*) [32])(auStack_160 + lVar81);
      auVar191._0_4_ = auVar97._0_4_ + (float)local_5c0._0_4_;
      auVar191._4_4_ = auVar97._4_4_ + (float)local_5c0._4_4_;
      auVar191._8_4_ = auVar97._8_4_ + fStack_5b8;
      auVar191._12_4_ = auVar97._12_4_ + fStack_5b4;
      auVar191._16_4_ = auVar97._16_4_ + fStack_5b0;
      auVar191._20_4_ = auVar97._20_4_ + fStack_5ac;
      auVar191._24_4_ = auVar97._24_4_ + fStack_5a8;
      auVar191._28_4_ = auVar97._28_4_ + fStack_5a4;
      uVar149 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar35._4_4_ = uVar149;
      auVar35._0_4_ = uVar149;
      auVar35._8_4_ = uVar149;
      auVar35._12_4_ = uVar149;
      auVar35._16_4_ = uVar149;
      auVar35._20_4_ = uVar149;
      auVar35._24_4_ = uVar149;
      auVar35._28_4_ = uVar149;
      uVar17 = vcmpps_avx512vl(auVar191,auVar35,2);
      uVar84 = (uint)uVar17 & (uint)abStack_180[lVar81];
      bVar74 = (byte)uVar84;
      uVar83 = uVar76;
      if (uVar84 != 0) {
        auVar192._8_4_ = 0x7f800000;
        auVar192._0_8_ = 0x7f8000007f800000;
        auVar192._12_4_ = 0x7f800000;
        auVar192._16_4_ = 0x7f800000;
        auVar192._20_4_ = 0x7f800000;
        auVar192._24_4_ = 0x7f800000;
        auVar192._28_4_ = 0x7f800000;
        auVar98 = vblendmps_avx512vl(auVar192,auVar97);
        auVar140._0_4_ =
             (uint)(bVar74 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar74 & 1) * (int)auVar97._0_4_;
        bVar82 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar140._4_4_ = (uint)bVar82 * auVar98._4_4_ | (uint)!bVar82 * (int)auVar97._4_4_;
        bVar82 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar140._8_4_ = (uint)bVar82 * auVar98._8_4_ | (uint)!bVar82 * (int)auVar97._8_4_;
        bVar82 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar140._12_4_ = (uint)bVar82 * auVar98._12_4_ | (uint)!bVar82 * (int)auVar97._12_4_;
        bVar82 = (bool)((byte)(uVar84 >> 4) & 1);
        auVar140._16_4_ = (uint)bVar82 * auVar98._16_4_ | (uint)!bVar82 * (int)auVar97._16_4_;
        bVar82 = (bool)((byte)(uVar84 >> 5) & 1);
        auVar140._20_4_ = (uint)bVar82 * auVar98._20_4_ | (uint)!bVar82 * (int)auVar97._20_4_;
        bVar82 = (bool)((byte)(uVar84 >> 6) & 1);
        auVar140._24_4_ = (uint)bVar82 * auVar98._24_4_ | (uint)!bVar82 * (int)auVar97._24_4_;
        auVar140._28_4_ =
             (uVar84 >> 7) * auVar98._28_4_ | (uint)!SUB41(uVar84 >> 7,0) * (int)auVar97._28_4_;
        auVar97 = vshufps_avx(auVar140,auVar140,0xb1);
        auVar97 = vminps_avx(auVar140,auVar97);
        auVar98 = vshufpd_avx(auVar97,auVar97,5);
        auVar97 = vminps_avx(auVar97,auVar98);
        auVar98 = vpermpd_avx2(auVar97,0x4e);
        auVar97 = vminps_avx(auVar97,auVar98);
        uVar17 = vcmpps_avx512vl(auVar140,auVar97,0);
        bVar79 = (byte)uVar17 & bVar74;
        if (bVar79 != 0) {
          uVar84 = (uint)bVar79;
        }
        fVar246 = afStack_140[uVar76 * 0x18 + 1];
        uVar141 = 0;
        for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
          uVar141 = uVar141 + 1;
        }
        local_888 = (ulong)auStack_138[uVar76 * 0x18];
        bVar79 = ~('\x01' << ((byte)uVar141 & 0x1f)) & bVar74;
        abStack_180[lVar81] = bVar79;
        if (bVar79 != 0) {
          uVar83 = local_880 & 0xffffffff;
        }
        fVar248 = afStack_140[uVar76 * 0x18];
        auVar193._4_4_ = fVar248;
        auVar193._0_4_ = fVar248;
        auVar193._8_4_ = fVar248;
        auVar193._12_4_ = fVar248;
        auVar193._16_4_ = fVar248;
        auVar193._20_4_ = fVar248;
        auVar193._24_4_ = fVar248;
        auVar193._28_4_ = fVar248;
        fVar246 = fVar246 - fVar248;
        auVar167._4_4_ = fVar246;
        auVar167._0_4_ = fVar246;
        auVar167._8_4_ = fVar246;
        auVar167._12_4_ = fVar246;
        auVar167._16_4_ = fVar246;
        auVar167._20_4_ = fVar246;
        auVar167._24_4_ = fVar246;
        auVar167._28_4_ = fVar246;
        auVar85 = vfmadd132ps_fma(auVar167,auVar193,_DAT_02020f20);
        _local_660 = ZEXT1632(auVar85);
        auVar211 = ZEXT864(*(ulong *)(local_660 + (ulong)uVar141 * 4));
      }
      local_880 = uVar83;
    } while (bVar74 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }